

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O0

void Js::AsmJsByteCodeDumper::DumpOp
               (OpCodeAsmJs op,LayoutSize layoutSize,ByteCodeReader *reader,
               FunctionBody *dumpFunction)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  char16 *pcVar4;
  OpLayoutElementSlot_Small *data;
  OpLayoutElementSlot_Medium *data_00;
  OpLayoutElementSlot_Large *data_01;
  OpLayoutStartCall *data_02;
  OpLayoutEmpty *data_03;
  OpLayoutAsmTypedArr_Small *data_04;
  OpLayoutAsmTypedArr_Medium *data_05;
  OpLayoutAsmTypedArr_Large *data_06;
  OpLayoutWasmMemAccess_Small *data_07;
  OpLayoutWasmMemAccess_Medium *data_08;
  OpLayoutWasmMemAccess_Large *data_09;
  OpLayoutAsmCall_Small *data_10;
  OpLayoutAsmCall_Medium *data_11;
  OpLayoutAsmCall_Large *data_12;
  OpLayoutProfiledAsmCall_Small *data_13;
  OpLayoutProfiledAsmCall_Medium *data_14;
  OpLayoutProfiledAsmCall_Large *data_15;
  OpLayoutAsmBr *data_16;
  OpLayoutAsmReg1_Small *data_17;
  OpLayoutAsmReg1_Medium *data_18;
  OpLayoutAsmReg1_Large *data_19;
  OpLayoutAsmReg2_Small *data_20;
  OpLayoutAsmReg2_Medium *data_21;
  OpLayoutAsmReg2_Large *data_22;
  OpLayoutAsmReg3_Small *data_23;
  OpLayoutAsmReg3_Medium *data_24;
  OpLayoutAsmReg3_Large *data_25;
  OpLayoutAsmReg4_Small *data_26;
  OpLayoutAsmReg4_Medium *data_27;
  OpLayoutAsmReg4_Large *data_28;
  OpLayoutAsmReg5_Small *data_29;
  OpLayoutAsmReg5_Medium *data_30;
  OpLayoutAsmReg5_Large *data_31;
  OpLayoutAsmReg6_Small *data_32;
  OpLayoutAsmReg6_Medium *data_33;
  OpLayoutAsmReg6_Large *data_34;
  OpLayoutAsmReg7_Small *data_35;
  OpLayoutAsmReg7_Medium *data_36;
  OpLayoutAsmReg7_Large *data_37;
  OpLayoutAsmReg9_Small *data_38;
  OpLayoutAsmReg9_Medium *data_39;
  OpLayoutAsmReg9_Large *data_40;
  OpLayoutAsmReg10_Small *data_41;
  OpLayoutAsmReg10_Medium *data_42;
  OpLayoutAsmReg10_Large *data_43;
  OpLayoutAsmReg11_Small *data_44;
  OpLayoutAsmReg11_Medium *data_45;
  OpLayoutAsmReg11_Large *data_46;
  OpLayoutAsmReg17_Small *data_47;
  OpLayoutAsmReg17_Medium *data_48;
  OpLayoutAsmReg17_Large *data_49;
  OpLayoutAsmReg18_Small *data_50;
  OpLayoutAsmReg18_Medium *data_51;
  OpLayoutAsmReg18_Large *data_52;
  OpLayoutAsmReg19_Small *data_53;
  OpLayoutAsmReg19_Medium *data_54;
  OpLayoutAsmReg19_Large *data_55;
  OpLayoutInt1Double1_Small *data_56;
  OpLayoutInt1Double1_Medium *data_57;
  OpLayoutInt1Double1_Large *data_58;
  OpLayoutInt1Float1_Small *data_59;
  OpLayoutInt1Float1_Medium *data_60;
  OpLayoutInt1Float1_Large *data_61;
  OpLayoutDouble1Const1_Small *data_62;
  OpLayoutDouble1Const1_Medium *data_63;
  OpLayoutDouble1Const1_Large *data_64;
  OpLayoutDouble1Int1_Small *data_65;
  OpLayoutDouble1Int1_Medium *data_66;
  OpLayoutDouble1Int1_Large *data_67;
  OpLayoutDouble1Float1_Small *data_68;
  OpLayoutDouble1Float1_Medium *data_69;
  OpLayoutDouble1Float1_Large *data_70;
  OpLayoutDouble1Reg1_Small *data_71;
  OpLayoutDouble1Reg1_Medium *data_72;
  OpLayoutDouble1Reg1_Large *data_73;
  OpLayoutFloat1Reg1_Small *data_74;
  OpLayoutFloat1Reg1_Medium *data_75;
  OpLayoutFloat1Reg1_Large *data_76;
  OpLayoutInt1Reg1_Small *data_77;
  OpLayoutInt1Reg1_Medium *data_78;
  OpLayoutInt1Reg1_Large *data_79;
  OpLayoutReg1Double1_Small *data_80;
  OpLayoutReg1Double1_Medium *data_81;
  OpLayoutReg1Double1_Large *data_82;
  OpLayoutReg1Float1_Small *data_83;
  OpLayoutReg1Float1_Medium *data_84;
  OpLayoutReg1Float1_Large *data_85;
  OpLayoutReg1Int1_Small *data_86;
  OpLayoutReg1Int1_Medium *data_87;
  OpLayoutReg1Int1_Large *data_88;
  OpLayoutInt1Const1_Small *data_89;
  OpLayoutInt1Const1_Medium *data_90;
  OpLayoutInt1Const1_Large *data_91;
  OpLayoutReg1IntConst1_Small *data_92;
  OpLayoutReg1IntConst1_Medium *data_93;
  OpLayoutReg1IntConst1_Large *data_94;
  OpLayoutInt1Double2_Small *data_95;
  OpLayoutInt1Double2_Medium *data_96;
  OpLayoutInt1Double2_Large *data_97;
  OpLayoutInt1Float2_Small *data_98;
  OpLayoutInt1Float2_Medium *data_99;
  OpLayoutInt1Float2_Large *data_x00100;
  OpLayoutInt2_Small *data_x00101;
  OpLayoutInt2_Medium *data_x00102;
  OpLayoutInt2_Large *data_x00103;
  OpLayoutInt3_Small *data_x00104;
  OpLayoutInt3_Medium *data_x00105;
  OpLayoutInt3_Large *data_x00106;
  OpLayoutDouble2_Small *data_x00107;
  OpLayoutDouble2_Medium *data_x00108;
  OpLayoutDouble2_Large *data_x00109;
  OpLayoutFloat2_Small *data_x00110;
  OpLayoutFloat2_Medium *data_x00111;
  OpLayoutFloat2_Large *data_x00112;
  OpLayoutFloat3_Small *data_x00113;
  OpLayoutFloat3_Medium *data_x00114;
  OpLayoutFloat3_Large *data_x00115;
  OpLayoutFloat1Const1_Small *data_x00116;
  OpLayoutFloat1Const1_Medium *data_x00117;
  OpLayoutFloat1Const1_Large *data_x00118;
  OpLayoutFloat1Double1_Small *data_x00119;
  OpLayoutFloat1Double1_Medium *data_x00120;
  OpLayoutFloat1Double1_Large *data_x00121;
  OpLayoutFloat1Int1_Small *data_x00122;
  OpLayoutFloat1Int1_Medium *data_x00123;
  OpLayoutFloat1Int1_Large *data_x00124;
  OpLayoutDouble3_Small *data_x00125;
  OpLayoutDouble3_Medium *data_x00126;
  OpLayoutDouble3_Large *data_x00127;
  OpLayoutBrInt1_Small *data_x00128;
  OpLayoutBrInt1_Medium *data_x00129;
  OpLayoutBrInt1_Large *data_x00130;
  OpLayoutBrInt2_Small *data_x00131;
  OpLayoutBrInt2_Medium *data_x00132;
  OpLayoutBrInt2_Large *data_x00133;
  OpLayoutBrInt1Const1_Small *data_x00134;
  OpLayoutBrInt1Const1_Medium *data_x00135;
  OpLayoutBrInt1Const1_Large *data_x00136;
  OpLayoutAsmUnsigned1_Small *data_x00137;
  OpLayoutAsmUnsigned1_Medium *data_x00138;
  OpLayoutAsmUnsigned1_Large *data_x00139;
  OpLayoutWasmLoopStart_Small *data_x00140;
  OpLayoutWasmLoopStart_Medium *data_x00141;
  OpLayoutWasmLoopStart_Large *data_x00142;
  OpLayoutLong1Reg1_Small *data_x00143;
  OpLayoutLong1Reg1_Medium *data_x00144;
  OpLayoutLong1Reg1_Large *data_x00145;
  OpLayoutReg1Long1_Small *data_x00146;
  OpLayoutReg1Long1_Medium *data_x00147;
  OpLayoutReg1Long1_Large *data_x00148;
  OpLayoutLong1Const1_Small *data_x00149;
  OpLayoutLong1Const1_Medium *data_x00150;
  OpLayoutLong1Const1_Large *data_x00151;
  OpLayoutLong2_Small *data_x00152;
  OpLayoutLong2_Medium *data_x00153;
  OpLayoutLong2_Large *data_x00154;
  OpLayoutLong3_Small *data_x00155;
  OpLayoutLong3_Medium *data_x00156;
  OpLayoutLong3_Large *data_x00157;
  OpLayoutInt1Long2_Small *data_x00158;
  OpLayoutInt1Long2_Medium *data_x00159;
  OpLayoutInt1Long2_Large *data_x00160;
  OpLayoutLong1Int1_Small *data_x00161;
  OpLayoutLong1Int1_Medium *data_x00162;
  OpLayoutLong1Int1_Large *data_x00163;
  OpLayoutInt1Long1_Small *data_x00164;
  OpLayoutInt1Long1_Medium *data_x00165;
  OpLayoutInt1Long1_Large *data_x00166;
  OpLayoutLong1Float1_Small *data_x00167;
  OpLayoutLong1Float1_Medium *data_x00168;
  OpLayoutLong1Float1_Large *data_x00169;
  OpLayoutFloat1Long1_Small *data_x00170;
  OpLayoutFloat1Long1_Medium *data_x00171;
  OpLayoutFloat1Long1_Large *data_x00172;
  OpLayoutLong1Double1_Small *data_x00173;
  OpLayoutLong1Double1_Medium *data_x00174;
  OpLayoutLong1Double1_Large *data_x00175;
  OpLayoutDouble1Long1_Small *data_x00176;
  OpLayoutDouble1Long1_Medium *data_x00177;
  OpLayoutDouble1Long1_Large *data_x00178;
  OpLayoutFloat32x4_2_Small *data_x00179;
  OpLayoutFloat32x4_2_Medium *data_x00180;
  OpLayoutFloat32x4_2_Large *data_x00181;
  OpLayoutFloat32x4_3_Small *data_x00182;
  OpLayoutFloat32x4_3_Medium *data_x00183;
  OpLayoutFloat32x4_3_Large *data_x00184;
  OpLayoutFloat32x4_4_Small *data_x00185;
  OpLayoutFloat32x4_4_Medium *data_x00186;
  OpLayoutFloat32x4_4_Large *data_x00187;
  OpLayoutBool32x4_1Float32x4_2_Small *data_x00188;
  OpLayoutBool32x4_1Float32x4_2_Medium *data_x00189;
  OpLayoutBool32x4_1Float32x4_2_Large *data_x00190;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Small *data_x00191;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Medium *data_x00192;
  OpLayoutFloat32x4_1Bool32x4_1Float32x4_2_Large *data_x00193;
  OpLayoutFloat32x4_1Float4_Small *data_x00194;
  OpLayoutFloat32x4_1Float4_Medium *data_x00195;
  OpLayoutFloat32x4_1Float4_Large *data_x00196;
  OpLayoutFloat32x4_2Int4_Small *data_x00197;
  OpLayoutFloat32x4_2Int4_Medium *data_x00198;
  OpLayoutFloat32x4_2Int4_Large *data_x00199;
  OpLayoutFloat32x4_3Int4_Small *data_x00200;
  OpLayoutFloat32x4_3Int4_Medium *data_x00201;
  OpLayoutFloat32x4_3Int4_Large *data_x00202;
  OpLayoutFloat32x4_1Float1_Small *data_x00203;
  OpLayoutFloat32x4_1Float1_Medium *data_x00204;
  OpLayoutFloat32x4_1Float1_Large *data_x00205;
  OpLayoutFloat32x4_2Float1_Small *data_x00206;
  OpLayoutFloat32x4_2Float1_Medium *data_x00207;
  OpLayoutFloat32x4_2Float1_Large *data_x00208;
  OpLayoutFloat32x4_1Int32x4_1_Small *data_x00209;
  OpLayoutFloat32x4_1Int32x4_1_Medium *data_x00210;
  OpLayoutFloat32x4_1Int32x4_1_Large *data_x00211;
  OpLayoutFloat32x4_1Uint32x4_1_Small *data_x00212;
  OpLayoutFloat32x4_1Uint32x4_1_Medium *data_x00213;
  OpLayoutFloat32x4_1Uint32x4_1_Large *data_x00214;
  OpLayoutFloat32x4_1Int16x8_1_Small *data_x00215;
  OpLayoutFloat32x4_1Int16x8_1_Medium *data_x00216;
  OpLayoutFloat32x4_1Int16x8_1_Large *data_x00217;
  OpLayoutFloat32x4_1Uint16x8_1_Small *data_x00218;
  OpLayoutFloat32x4_1Uint16x8_1_Medium *data_x00219;
  OpLayoutFloat32x4_1Uint16x8_1_Large *data_x00220;
  OpLayoutFloat32x4_1Int8x16_1_Small *data_x00221;
  OpLayoutFloat32x4_1Int8x16_1_Medium *data_x00222;
  OpLayoutFloat32x4_1Int8x16_1_Large *data_x00223;
  OpLayoutFloat32x4_1Uint8x16_1_Small *data_x00224;
  OpLayoutFloat32x4_1Uint8x16_1_Medium *data_x00225;
  OpLayoutFloat32x4_1Uint8x16_1_Large *data_x00226;
  OpLayoutReg1Float32x4_1_Small *data_x00227;
  OpLayoutReg1Float32x4_1_Medium *data_x00228;
  OpLayoutReg1Float32x4_1_Large *data_x00229;
  OpLayoutFloat1Float32x4_1Int1_Small *data_x00230;
  OpLayoutFloat1Float32x4_1Int1_Medium *data_x00231;
  OpLayoutFloat1Float32x4_1Int1_Large *data_x00232;
  OpLayoutFloat32x4_2Int1Float1_Small *data_x00233;
  OpLayoutFloat32x4_2Int1Float1_Medium *data_x00234;
  OpLayoutFloat32x4_2Int1Float1_Large *data_x00235;
  OpLayoutInt32x4_2_Small *data_x00236;
  OpLayoutInt32x4_2_Medium *data_x00237;
  OpLayoutInt32x4_2_Large *data_x00238;
  OpLayoutInt32x4_3_Small *data_x00239;
  OpLayoutInt32x4_3_Medium *data_x00240;
  OpLayoutInt32x4_3_Large *data_x00241;
  OpLayoutInt32x4_4_Small *data_x00242;
  OpLayoutInt32x4_4_Medium *data_x00243;
  OpLayoutInt32x4_4_Large *data_x00244;
  OpLayoutBool32x4_1Int32x4_2_Small *data_x00245;
  OpLayoutBool32x4_1Int32x4_2_Medium *data_x00246;
  OpLayoutBool32x4_1Int32x4_2_Large *data_x00247;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Small *data_x00248;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Medium *data_x00249;
  OpLayoutInt32x4_1Bool32x4_1Int32x4_2_Large *data_x00250;
  OpLayoutInt32x4_1Int4_Small *data_x00251;
  OpLayoutInt32x4_1Int4_Medium *data_x00252;
  OpLayoutInt32x4_1Int4_Large *data_x00253;
  OpLayoutInt32x4_2Int4_Small *data_x00254;
  OpLayoutInt32x4_2Int4_Medium *data_x00255;
  OpLayoutInt32x4_2Int4_Large *data_x00256;
  OpLayoutInt32x4_3Int4_Small *data_x00257;
  OpLayoutInt32x4_3Int4_Medium *data_x00258;
  OpLayoutInt32x4_3Int4_Large *data_x00259;
  OpLayoutInt32x4_1Int1_Small *data_x00260;
  OpLayoutInt32x4_1Int1_Medium *data_x00261;
  OpLayoutInt32x4_1Int1_Large *data_x00262;
  OpLayoutInt32x4_2Int1_Small *data_x00263;
  OpLayoutInt32x4_2Int1_Medium *data_x00264;
  OpLayoutInt32x4_2Int1_Large *data_x00265;
  OpLayoutReg1Int32x4_1_Small *data_x00266;
  OpLayoutReg1Int32x4_1_Medium *data_x00267;
  OpLayoutReg1Int32x4_1_Large *data_x00268;
  OpLayoutInt32x4_1Float32x4_1_Small *data_x00269;
  OpLayoutInt32x4_1Float32x4_1_Medium *data_x00270;
  OpLayoutInt32x4_1Float32x4_1_Large *data_x00271;
  OpLayoutInt32x4_1Uint32x4_1_Small *data_x00272;
  OpLayoutInt32x4_1Uint32x4_1_Medium *data_x00273;
  OpLayoutInt32x4_1Uint32x4_1_Large *data_x00274;
  OpLayoutInt32x4_1Int16x8_1_Small *data_x00275;
  OpLayoutInt32x4_1Int16x8_1_Medium *data_x00276;
  OpLayoutInt32x4_1Int16x8_1_Large *data_x00277;
  OpLayoutInt32x4_1Uint16x8_1_Small *data_x00278;
  OpLayoutInt32x4_1Uint16x8_1_Medium *data_x00279;
  OpLayoutInt32x4_1Uint16x8_1_Large *data_x00280;
  OpLayoutInt32x4_1Int8x16_1_Small *data_x00281;
  OpLayoutInt32x4_1Int8x16_1_Medium *data_x00282;
  OpLayoutInt32x4_1Int8x16_1_Large *data_x00283;
  OpLayoutInt32x4_1Uint8x16_1_Small *data_x00284;
  OpLayoutInt32x4_1Uint8x16_1_Medium *data_x00285;
  OpLayoutInt32x4_1Uint8x16_1_Large *data_x00286;
  OpLayoutInt1Int32x4_1Int1_Small *data_x00287;
  OpLayoutInt1Int32x4_1Int1_Medium *data_x00288;
  OpLayoutInt1Int32x4_1Int1_Large *data_x00289;
  OpLayoutInt32x4_2Int2_Small *data_x00290;
  OpLayoutInt32x4_2Int2_Medium *data_x00291;
  OpLayoutInt32x4_2Int2_Large *data_x00292;
  OpLayoutFloat32x4_IntConst4_Small *data_x00293;
  OpLayoutFloat32x4_IntConst4_Medium *data_x00294;
  OpLayoutFloat32x4_IntConst4_Large *data_x00295;
  OpLayoutDouble1Float64x2_1Int1_Small *data_x00296;
  OpLayoutDouble1Float64x2_1Int1_Medium *data_x00297;
  OpLayoutDouble1Float64x2_1Int1_Large *data_x00298;
  OpLayoutFloat64x2_2Int1Double1_Small *data_x00299;
  OpLayoutFloat64x2_2Int1Double1_Medium *data_x00300;
  OpLayoutFloat64x2_2Int1Double1_Large *data_x00301;
  OpLayoutFloat64x2_2_Small *data_x00302;
  OpLayoutFloat64x2_2_Medium *data_x00303;
  OpLayoutFloat64x2_2_Large *data_x00304;
  OpLayoutFloat64x2_3_Small *data_x00305;
  OpLayoutFloat64x2_3_Medium *data_x00306;
  OpLayoutFloat64x2_3_Large *data_x00307;
  OpLayoutFloat64x2_1Double1_Small *data_x00308;
  OpLayoutFloat64x2_1Double1_Medium *data_x00309;
  OpLayoutFloat64x2_1Double1_Large *data_x00310;
  OpLayoutInt64x2_1Long1_Small *data_x00311;
  OpLayoutInt64x2_1Long1_Medium *data_x00312;
  OpLayoutInt64x2_1Long1_Large *data_x00313;
  OpLayoutLong1Int64x2_1Int1_Small *data_x00314;
  OpLayoutLong1Int64x2_1Int1_Medium *data_x00315;
  OpLayoutLong1Int64x2_1Int1_Large *data_x00316;
  OpLayoutInt64x2_2_Int1_Long1_Small *data_x00317;
  OpLayoutInt64x2_2_Int1_Long1_Medium *data_x00318;
  OpLayoutInt64x2_2_Int1_Long1_Large *data_x00319;
  OpLayoutInt64x2_3_Small *data_x00320;
  OpLayoutInt64x2_3_Medium *data_x00321;
  OpLayoutInt64x2_3_Large *data_x00322;
  OpLayoutInt64x2_2_Small *data_x00323;
  OpLayoutInt64x2_2_Medium *data_x00324;
  OpLayoutInt64x2_2_Large *data_x00325;
  OpLayoutInt64x2_2Int1_Small *data_x00326;
  OpLayoutInt64x2_2Int1_Medium *data_x00327;
  OpLayoutInt64x2_2Int1_Large *data_x00328;
  OpLayoutInt1Bool64x2_1_Small *data_x00329;
  OpLayoutInt1Bool64x2_1_Medium *data_x00330;
  OpLayoutInt1Bool64x2_1_Large *data_x00331;
  OpLayoutInt16x8_1Int8_Small *data_x00332;
  OpLayoutInt16x8_1Int8_Medium *data_x00333;
  OpLayoutInt16x8_1Int8_Large *data_x00334;
  OpLayoutReg1Int16x8_1_Small *data_x00335;
  OpLayoutReg1Int16x8_1_Medium *data_x00336;
  OpLayoutReg1Int16x8_1_Large *data_x00337;
  OpLayoutInt16x8_2_Small *data_x00338;
  OpLayoutInt16x8_2_Medium *data_x00339;
  OpLayoutInt16x8_2_Large *data_x00340;
  OpLayoutInt1Int16x8_1Int1_Small *data_x00341;
  OpLayoutInt1Int16x8_1Int1_Medium *data_x00342;
  OpLayoutInt1Int16x8_1Int1_Large *data_x00343;
  OpLayoutInt16x8_2Int8_Small *data_x00344;
  OpLayoutInt16x8_2Int8_Medium *data_x00345;
  OpLayoutInt16x8_2Int8_Large *data_x00346;
  OpLayoutInt16x8_3Int8_Small *data_x00347;
  OpLayoutInt16x8_3Int8_Medium *data_x00348;
  OpLayoutInt16x8_3Int8_Large *data_x00349;
  OpLayoutInt16x8_1Int1_Small *data_x00350;
  OpLayoutInt16x8_1Int1_Medium *data_x00351;
  OpLayoutInt16x8_1Int1_Large *data_x00352;
  OpLayoutInt16x8_2Int2_Small *data_x00353;
  OpLayoutInt16x8_2Int2_Medium *data_x00354;
  OpLayoutInt16x8_2Int2_Large *data_x00355;
  OpLayoutInt16x8_3_Small *data_x00356;
  OpLayoutInt16x8_3_Medium *data_x00357;
  OpLayoutInt16x8_3_Large *data_x00358;
  OpLayoutBool16x8_1Int16x8_2_Small *data_x00359;
  OpLayoutBool16x8_1Int16x8_2_Medium *data_x00360;
  OpLayoutBool16x8_1Int16x8_2_Large *data_x00361;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Small *data_x00362;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Medium *data_x00363;
  OpLayoutInt16x8_1Bool16x8_1Int16x8_2_Large *data_x00364;
  OpLayoutInt16x8_2Int1_Small *data_x00365;
  OpLayoutInt16x8_2Int1_Medium *data_x00366;
  OpLayoutInt16x8_2Int1_Large *data_x00367;
  OpLayoutInt16x8_1Float32x4_1_Small *data_x00368;
  OpLayoutInt16x8_1Float32x4_1_Medium *data_x00369;
  OpLayoutInt16x8_1Float32x4_1_Large *data_x00370;
  OpLayoutInt16x8_1Int32x4_1_Small *data_x00371;
  OpLayoutInt16x8_1Int32x4_1_Medium *data_x00372;
  OpLayoutInt16x8_1Int32x4_1_Large *data_x00373;
  OpLayoutInt16x8_1Int8x16_1_Small *data_x00374;
  OpLayoutInt16x8_1Int8x16_1_Medium *data_x00375;
  OpLayoutInt16x8_1Int8x16_1_Large *data_x00376;
  OpLayoutInt16x8_1Uint32x4_1_Small *data_x00377;
  OpLayoutInt16x8_1Uint32x4_1_Medium *data_x00378;
  OpLayoutInt16x8_1Uint32x4_1_Large *data_x00379;
  OpLayoutInt16x8_1Uint16x8_1_Small *data_x00380;
  OpLayoutInt16x8_1Uint16x8_1_Medium *data_x00381;
  OpLayoutInt16x8_1Uint16x8_1_Large *data_x00382;
  OpLayoutInt16x8_1Uint8x16_1_Small *data_x00383;
  OpLayoutInt16x8_1Uint8x16_1_Medium *data_x00384;
  OpLayoutInt16x8_1Uint8x16_1_Large *data_x00385;
  OpLayoutInt8x16_2_Small *data_x00386;
  OpLayoutInt8x16_2_Medium *data_x00387;
  OpLayoutInt8x16_2_Large *data_x00388;
  OpLayoutInt8x16_3_Small *data_x00389;
  OpLayoutInt8x16_3_Medium *data_x00390;
  OpLayoutInt8x16_3_Large *data_x00391;
  OpLayoutInt8x16_1Int16_Small *data_x00392;
  OpLayoutInt8x16_1Int16_Medium *data_x00393;
  OpLayoutInt8x16_1Int16_Large *data_x00394;
  OpLayoutInt8x16_2Int16_Small *data_x00395;
  OpLayoutInt8x16_2Int16_Medium *data_x00396;
  OpLayoutInt8x16_2Int16_Large *data_x00397;
  OpLayoutInt8x16_3Int16_Small *data_x00398;
  OpLayoutInt8x16_3Int16_Medium *data_x00399;
  OpLayoutInt8x16_3Int16_Large *data_x00400;
  OpLayoutInt8x16_1Int1_Small *data_x00401;
  OpLayoutInt8x16_1Int1_Medium *data_x00402;
  OpLayoutInt8x16_1Int1_Large *data_x00403;
  OpLayoutInt8x16_2Int1_Small *data_x00404;
  OpLayoutInt8x16_2Int1_Medium *data_x00405;
  OpLayoutInt8x16_2Int1_Large *data_x00406;
  OpLayoutReg1Int8x16_1_Small *data_x00407;
  OpLayoutReg1Int8x16_1_Medium *data_x00408;
  OpLayoutReg1Int8x16_1_Large *data_x00409;
  OpLayoutBool8x16_1Int8x16_2_Small *data_x00410;
  OpLayoutBool8x16_1Int8x16_2_Medium *data_x00411;
  OpLayoutBool8x16_1Int8x16_2_Large *data_x00412;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Small *data_x00413;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Medium *data_x00414;
  OpLayoutInt8x16_1Bool8x16_1Int8x16_2_Large *data_x00415;
  OpLayoutInt8x16_1Float32x4_1_Small *data_x00416;
  OpLayoutInt8x16_1Float32x4_1_Medium *data_x00417;
  OpLayoutInt8x16_1Float32x4_1_Large *data_x00418;
  OpLayoutInt8x16_1Int32x4_1_Small *data_x00419;
  OpLayoutInt8x16_1Int32x4_1_Medium *data_x00420;
  OpLayoutInt8x16_1Int32x4_1_Large *data_x00421;
  OpLayoutInt8x16_1Int16x8_1_Small *data_x00422;
  OpLayoutInt8x16_1Int16x8_1_Medium *data_x00423;
  OpLayoutInt8x16_1Int16x8_1_Large *data_x00424;
  OpLayoutInt8x16_1Uint32x4_1_Small *data_x00425;
  OpLayoutInt8x16_1Uint32x4_1_Medium *data_x00426;
  OpLayoutInt8x16_1Uint32x4_1_Large *data_x00427;
  OpLayoutInt8x16_1Uint16x8_1_Small *data_x00428;
  OpLayoutInt8x16_1Uint16x8_1_Medium *data_x00429;
  OpLayoutInt8x16_1Uint16x8_1_Large *data_x00430;
  OpLayoutInt8x16_1Uint8x16_1_Small *data_x00431;
  OpLayoutInt8x16_1Uint8x16_1_Medium *data_x00432;
  OpLayoutInt8x16_1Uint8x16_1_Large *data_x00433;
  OpLayoutInt1Int8x16_1Int1_Small *data_x00434;
  OpLayoutInt1Int8x16_1Int1_Medium *data_x00435;
  OpLayoutInt1Int8x16_1Int1_Large *data_x00436;
  OpLayoutInt8x16_2Int2_Small *data_x00437;
  OpLayoutInt8x16_2Int2_Medium *data_x00438;
  OpLayoutInt8x16_2Int2_Large *data_x00439;
  OpLayoutUint32x4_1Int4_Small *data_x00440;
  OpLayoutUint32x4_1Int4_Medium *data_x00441;
  OpLayoutUint32x4_1Int4_Large *data_x00442;
  OpLayoutReg1Uint32x4_1_Small *data_x00443;
  OpLayoutReg1Uint32x4_1_Medium *data_x00444;
  OpLayoutReg1Uint32x4_1_Large *data_x00445;
  OpLayoutUint32x4_2_Small *data_x00446;
  OpLayoutUint32x4_2_Medium *data_x00447;
  OpLayoutUint32x4_2_Large *data_x00448;
  OpLayoutInt1Uint32x4_1Int1_Small *data_x00449;
  OpLayoutInt1Uint32x4_1Int1_Medium *data_x00450;
  OpLayoutInt1Uint32x4_1Int1_Large *data_x00451;
  OpLayoutUint32x4_2Int4_Small *data_x00452;
  OpLayoutUint32x4_2Int4_Medium *data_x00453;
  OpLayoutUint32x4_2Int4_Large *data_x00454;
  OpLayoutUint32x4_3Int4_Small *data_x00455;
  OpLayoutUint32x4_3Int4_Medium *data_x00456;
  OpLayoutUint32x4_3Int4_Large *data_x00457;
  OpLayoutUint32x4_1Int1_Small *data_x00458;
  OpLayoutUint32x4_1Int1_Medium *data_x00459;
  OpLayoutUint32x4_1Int1_Large *data_x00460;
  OpLayoutUint32x4_2Int2_Small *data_x00461;
  OpLayoutUint32x4_2Int2_Medium *data_x00462;
  OpLayoutUint32x4_2Int2_Large *data_x00463;
  OpLayoutUint32x4_3_Small *data_x00464;
  OpLayoutUint32x4_3_Medium *data_x00465;
  OpLayoutUint32x4_3_Large *data_x00466;
  OpLayoutBool32x4_1Uint32x4_2_Small *data_x00467;
  OpLayoutBool32x4_1Uint32x4_2_Medium *data_x00468;
  OpLayoutBool32x4_1Uint32x4_2_Large *data_x00469;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Small *data_x00470;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Medium *data_x00471;
  OpLayoutUint32x4_1Bool32x4_1Uint32x4_2_Large *data_x00472;
  OpLayoutUint32x4_2Int1_Small *data_x00473;
  OpLayoutUint32x4_2Int1_Medium *data_x00474;
  OpLayoutUint32x4_2Int1_Large *data_x00475;
  OpLayoutUint32x4_1Float32x4_1_Small *data_x00476;
  OpLayoutUint32x4_1Float32x4_1_Medium *data_x00477;
  OpLayoutUint32x4_1Float32x4_1_Large *data_x00478;
  OpLayoutUint32x4_1Int32x4_1_Small *data_x00479;
  OpLayoutUint32x4_1Int32x4_1_Medium *data_x00480;
  OpLayoutUint32x4_1Int32x4_1_Large *data_x00481;
  OpLayoutUint32x4_1Int16x8_1_Small *data_x00482;
  OpLayoutUint32x4_1Int16x8_1_Medium *data_x00483;
  OpLayoutUint32x4_1Int16x8_1_Large *data_x00484;
  OpLayoutUint32x4_1Int8x16_1_Small *data_x00485;
  OpLayoutUint32x4_1Int8x16_1_Medium *data_x00486;
  OpLayoutUint32x4_1Int8x16_1_Large *data_x00487;
  OpLayoutUint32x4_1Uint16x8_1_Small *data_x00488;
  OpLayoutUint32x4_1Uint16x8_1_Medium *data_x00489;
  OpLayoutUint32x4_1Uint16x8_1_Large *data_x00490;
  OpLayoutUint32x4_1Uint8x16_1_Small *data_x00491;
  OpLayoutUint32x4_1Uint8x16_1_Medium *data_x00492;
  OpLayoutUint32x4_1Uint8x16_1_Large *data_x00493;
  OpLayoutUint16x8_1Int8_Small *data_x00494;
  OpLayoutUint16x8_1Int8_Medium *data_x00495;
  OpLayoutUint16x8_1Int8_Large *data_x00496;
  OpLayoutReg1Uint16x8_1_Small *data_x00497;
  OpLayoutReg1Uint16x8_1_Medium *data_x00498;
  OpLayoutReg1Uint16x8_1_Large *data_x00499;
  OpLayoutUint16x8_2_Small *data_x00500;
  OpLayoutUint16x8_2_Medium *data_x00501;
  OpLayoutUint16x8_2_Large *data_x00502;
  OpLayoutInt1Uint16x8_1Int1_Small *data_x00503;
  OpLayoutInt1Uint16x8_1Int1_Medium *data_x00504;
  OpLayoutInt1Uint16x8_1Int1_Large *data_x00505;
  OpLayoutUint16x8_2Int8_Small *data_x00506;
  OpLayoutUint16x8_2Int8_Medium *data_x00507;
  OpLayoutUint16x8_2Int8_Large *data_x00508;
  OpLayoutUint16x8_3Int8_Small *data_x00509;
  OpLayoutUint16x8_3Int8_Medium *data_x00510;
  OpLayoutUint16x8_3Int8_Large *data_x00511;
  OpLayoutUint16x8_1Int1_Small *data_x00512;
  OpLayoutUint16x8_1Int1_Medium *data_x00513;
  OpLayoutUint16x8_1Int1_Large *data_x00514;
  OpLayoutUint16x8_2Int2_Small *data_x00515;
  OpLayoutUint16x8_2Int2_Medium *data_x00516;
  OpLayoutUint16x8_2Int2_Large *data_x00517;
  OpLayoutUint16x8_3_Small *data_x00518;
  OpLayoutUint16x8_3_Medium *data_x00519;
  OpLayoutUint16x8_3_Large *data_x00520;
  OpLayoutBool16x8_1Uint16x8_2_Small *data_x00521;
  OpLayoutBool16x8_1Uint16x8_2_Medium *data_x00522;
  OpLayoutBool16x8_1Uint16x8_2_Large *data_x00523;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Small *data_x00524;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Medium *data_x00525;
  OpLayoutUint16x8_1Bool16x8_1Uint16x8_2_Large *data_x00526;
  OpLayoutUint16x8_2Int1_Small *data_x00527;
  OpLayoutUint16x8_2Int1_Medium *data_x00528;
  OpLayoutUint16x8_2Int1_Large *data_x00529;
  OpLayoutUint16x8_1Float32x4_1_Small *data_x00530;
  OpLayoutUint16x8_1Float32x4_1_Medium *data_x00531;
  OpLayoutUint16x8_1Float32x4_1_Large *data_x00532;
  OpLayoutUint16x8_1Int32x4_1_Small *data_x00533;
  OpLayoutUint16x8_1Int32x4_1_Medium *data_x00534;
  OpLayoutUint16x8_1Int32x4_1_Large *data_x00535;
  OpLayoutUint16x8_1Int16x8_1_Small *data_x00536;
  OpLayoutUint16x8_1Int16x8_1_Medium *data_x00537;
  OpLayoutUint16x8_1Int16x8_1_Large *data_x00538;
  OpLayoutUint16x8_1Int8x16_1_Small *data_x00539;
  OpLayoutUint16x8_1Int8x16_1_Medium *data_x00540;
  OpLayoutUint16x8_1Int8x16_1_Large *data_x00541;
  OpLayoutUint16x8_1Uint32x4_1_Small *data_x00542;
  OpLayoutUint16x8_1Uint32x4_1_Medium *data_x00543;
  OpLayoutUint16x8_1Uint32x4_1_Large *data_x00544;
  OpLayoutUint16x8_1Uint8x16_1_Small *data_x00545;
  OpLayoutUint16x8_1Uint8x16_1_Medium *data_x00546;
  OpLayoutUint16x8_1Uint8x16_1_Large *data_x00547;
  OpLayoutUint8x16_1Int16_Small *data_x00548;
  OpLayoutUint8x16_1Int16_Medium *data_x00549;
  OpLayoutUint8x16_1Int16_Large *data_x00550;
  OpLayoutReg1Uint8x16_1_Small *data_x00551;
  OpLayoutReg1Uint8x16_1_Medium *data_x00552;
  OpLayoutReg1Uint8x16_1_Large *data_x00553;
  OpLayoutUint8x16_2_Small *data_x00554;
  OpLayoutUint8x16_2_Medium *data_x00555;
  OpLayoutUint8x16_2_Large *data_x00556;
  OpLayoutInt1Uint8x16_1Int1_Small *data_x00557;
  OpLayoutInt1Uint8x16_1Int1_Medium *data_x00558;
  OpLayoutInt1Uint8x16_1Int1_Large *data_x00559;
  OpLayoutUint8x16_2Int16_Small *data_x00560;
  OpLayoutUint8x16_2Int16_Medium *data_x00561;
  OpLayoutUint8x16_2Int16_Large *data_x00562;
  OpLayoutUint8x16_3Int16_Small *data_x00563;
  OpLayoutUint8x16_3Int16_Medium *data_x00564;
  OpLayoutUint8x16_3Int16_Large *data_x00565;
  OpLayoutUint8x16_1Int1_Small *data_x00566;
  OpLayoutUint8x16_1Int1_Medium *data_x00567;
  OpLayoutUint8x16_1Int1_Large *data_x00568;
  OpLayoutUint8x16_2Int2_Small *data_x00569;
  OpLayoutUint8x16_2Int2_Medium *data_x00570;
  OpLayoutUint8x16_2Int2_Large *data_x00571;
  OpLayoutUint8x16_3_Small *data_x00572;
  OpLayoutUint8x16_3_Medium *data_x00573;
  OpLayoutUint8x16_3_Large *data_x00574;
  OpLayoutBool8x16_1Uint8x16_2_Small *data_x00575;
  OpLayoutBool8x16_1Uint8x16_2_Medium *data_x00576;
  OpLayoutBool8x16_1Uint8x16_2_Large *data_x00577;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Small *data_x00578;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Medium *data_x00579;
  OpLayoutUint8x16_1Bool8x16_1Uint8x16_2_Large *data_x00580;
  OpLayoutUint8x16_2Int1_Small *data_x00581;
  OpLayoutUint8x16_2Int1_Medium *data_x00582;
  OpLayoutUint8x16_2Int1_Large *data_x00583;
  OpLayoutUint8x16_1Float32x4_1_Small *data_x00584;
  OpLayoutUint8x16_1Float32x4_1_Medium *data_x00585;
  OpLayoutUint8x16_1Float32x4_1_Large *data_x00586;
  OpLayoutUint8x16_1Int32x4_1_Small *data_x00587;
  OpLayoutUint8x16_1Int32x4_1_Medium *data_x00588;
  OpLayoutUint8x16_1Int32x4_1_Large *data_x00589;
  OpLayoutUint8x16_1Int16x8_1_Small *data_x00590;
  OpLayoutUint8x16_1Int16x8_1_Medium *data_x00591;
  OpLayoutUint8x16_1Int16x8_1_Large *data_x00592;
  OpLayoutUint8x16_1Int8x16_1_Small *data_x00593;
  OpLayoutUint8x16_1Int8x16_1_Medium *data_x00594;
  OpLayoutUint8x16_1Int8x16_1_Large *data_x00595;
  OpLayoutUint8x16_1Uint32x4_1_Small *data_x00596;
  OpLayoutUint8x16_1Uint32x4_1_Medium *data_x00597;
  OpLayoutUint8x16_1Uint32x4_1_Large *data_x00598;
  OpLayoutUint8x16_1Uint16x8_1_Small *data_x00599;
  OpLayoutUint8x16_1Uint16x8_1_Medium *data_x00600;
  OpLayoutUint8x16_1Uint16x8_1_Large *data_x00601;
  OpLayoutBool32x4_1Int1_Small *data_x00602;
  OpLayoutBool32x4_1Int1_Medium *data_x00603;
  OpLayoutBool32x4_1Int1_Large *data_x00604;
  OpLayoutBool32x4_1Int4_Small *data_x00605;
  OpLayoutBool32x4_1Int4_Medium *data_x00606;
  OpLayoutBool32x4_1Int4_Large *data_x00607;
  OpLayoutInt1Bool32x4_1Int1_Small *data_x00608;
  OpLayoutInt1Bool32x4_1Int1_Medium *data_x00609;
  OpLayoutInt1Bool32x4_1Int1_Large *data_x00610;
  OpLayoutBool32x4_2Int2_Small *data_x00611;
  OpLayoutBool32x4_2Int2_Medium *data_x00612;
  OpLayoutBool32x4_2Int2_Large *data_x00613;
  OpLayoutInt1Bool32x4_1_Small *data_x00614;
  OpLayoutInt1Bool32x4_1_Medium *data_x00615;
  OpLayoutInt1Bool32x4_1_Large *data_x00616;
  OpLayoutBool32x4_2_Small *data_x00617;
  OpLayoutBool32x4_2_Medium *data_x00618;
  OpLayoutBool32x4_2_Large *data_x00619;
  OpLayoutBool32x4_3_Small *data_x00620;
  OpLayoutBool32x4_3_Medium *data_x00621;
  OpLayoutBool32x4_3_Large *data_x00622;
  OpLayoutReg1Bool32x4_1_Small *data_x00623;
  OpLayoutReg1Bool32x4_1_Medium *data_x00624;
  OpLayoutReg1Bool32x4_1_Large *data_x00625;
  OpLayoutBool16x8_1Int1_Small *data_x00626;
  OpLayoutBool16x8_1Int1_Medium *data_x00627;
  OpLayoutBool16x8_1Int1_Large *data_x00628;
  OpLayoutBool16x8_1Int8_Small *data_x00629;
  OpLayoutBool16x8_1Int8_Medium *data_x00630;
  OpLayoutBool16x8_1Int8_Large *data_x00631;
  OpLayoutInt1Bool16x8_1Int1_Small *data_x00632;
  OpLayoutInt1Bool16x8_1Int1_Medium *data_x00633;
  OpLayoutInt1Bool16x8_1Int1_Large *data_x00634;
  OpLayoutBool16x8_2Int2_Small *data_x00635;
  OpLayoutBool16x8_2Int2_Medium *data_x00636;
  OpLayoutBool16x8_2Int2_Large *data_x00637;
  OpLayoutInt1Bool16x8_1_Small *data_x00638;
  OpLayoutInt1Bool16x8_1_Medium *data_x00639;
  OpLayoutInt1Bool16x8_1_Large *data_x00640;
  OpLayoutBool16x8_2_Small *data_x00641;
  OpLayoutBool16x8_2_Medium *data_x00642;
  OpLayoutBool16x8_2_Large *data_x00643;
  OpLayoutBool16x8_3_Small *data_x00644;
  OpLayoutBool16x8_3_Medium *data_x00645;
  OpLayoutBool16x8_3_Large *data_x00646;
  OpLayoutReg1Bool16x8_1_Small *data_x00647;
  OpLayoutReg1Bool16x8_1_Medium *data_x00648;
  OpLayoutReg1Bool16x8_1_Large *data_x00649;
  OpLayoutBool8x16_1Int1_Small *data_x00650;
  OpLayoutBool8x16_1Int1_Medium *data_x00651;
  OpLayoutBool8x16_1Int1_Large *data_x00652;
  OpLayoutBool8x16_1Int16_Small *data_x00653;
  OpLayoutBool8x16_1Int16_Medium *data_x00654;
  OpLayoutBool8x16_1Int16_Large *data_x00655;
  OpLayoutInt1Bool8x16_1_Small *data_x00656;
  OpLayoutInt1Bool8x16_1_Medium *data_x00657;
  OpLayoutInt1Bool8x16_1_Large *data_x00658;
  OpLayoutInt1Bool8x16_1Int1_Small *data_x00659;
  OpLayoutInt1Bool8x16_1Int1_Medium *data_x00660;
  OpLayoutInt1Bool8x16_1Int1_Large *data_x00661;
  OpLayoutBool8x16_2Int2_Small *data_x00662;
  OpLayoutBool8x16_2Int2_Medium *data_x00663;
  OpLayoutBool8x16_2Int2_Large *data_x00664;
  OpLayoutBool8x16_2_Small *data_x00665;
  OpLayoutBool8x16_2_Medium *data_x00666;
  OpLayoutBool8x16_2_Large *data_x00667;
  OpLayoutBool8x16_3_Small *data_x00668;
  OpLayoutBool8x16_3_Medium *data_x00669;
  OpLayoutBool8x16_3_Large *data_x00670;
  OpLayoutReg1Bool8x16_1_Small *data_x00671;
  OpLayoutReg1Bool8x16_1_Medium *data_x00672;
  OpLayoutReg1Bool8x16_1_Large *data_x00673;
  OpLayoutAsmSimdTypedArr_Small *data_x00674;
  OpLayoutAsmSimdTypedArr_Medium *data_x00675;
  OpLayoutAsmSimdTypedArr_Large *data_x00676;
  OpLayoutAsmShuffle_Small *data_x00677;
  OpLayoutAsmShuffle_Medium *data_x00678;
  OpLayoutAsmShuffle_Large *data_x00679;
  undefined4 *puVar5;
  OpLayoutTypeAsmJs local_24;
  FunctionBody *pFStack_20;
  OpLayoutTypeAsmJs nType;
  FunctionBody *dumpFunction_local;
  ByteCodeReader *reader_local;
  LayoutSize layoutSize_local;
  OpCodeAsmJs op_local;
  
  pFStack_20 = dumpFunction;
  pcVar4 = OpCodeUtilAsmJs::GetOpCodeName(op);
  Output::Print(L"%-20s",pcVar4);
  local_24 = OpCodeUtilAsmJs::GetOpCodeLayout(op);
  _Var3 = OpLayoutTypeAsmJs::operator_cast_to__E(&local_24);
  switch(layoutSize * 0xe5 + _Var3) {
  case SmallLayout:
    data = ByteCodeReader::ElementSlot_Small(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data,pFStack_20,reader);
    break;
  case MediumLayout:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x82,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_02 = ByteCodeReader::StartCall(reader);
    DumpStartCall(op,data_02,pFStack_20,reader);
    break;
  case LargeLayout:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x83,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_03 = ByteCodeReader::Empty(reader);
    DumpEmpty(op,data_03,pFStack_20,reader);
    break;
  case LayoutCount:
    data_04 = ByteCodeReader::AsmTypedArr_Small(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_04,pFStack_20,reader);
    break;
  case 4:
    data_07 = ByteCodeReader::WasmMemAccess_Small(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_07,pFStack_20,reader);
    break;
  case 5:
    data_10 = ByteCodeReader::AsmCall_Small(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_10,pFStack_20,reader);
    break;
  case 6:
    data_13 = ByteCodeReader::ProfiledAsmCall_Small(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
              (op,data_13,pFStack_20,reader);
    break;
  case 7:
    if (layoutSize != SmallLayout) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/LayoutTypesAsmJs.h"
                                  ,0x88,"(layoutSize == SmallLayout)","layoutSize == SmallLayout");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    data_16 = ByteCodeReader::AsmBr(reader);
    DumpAsmBr(op,data_16,pFStack_20,reader);
    break;
  case 8:
    data_17 = ByteCodeReader::AsmReg1_Small(reader);
    DumpAsmReg1<Js::OpLayoutT_AsmReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_17,pFStack_20,reader);
    break;
  case 9:
    data_20 = ByteCodeReader::AsmReg2_Small(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_20,pFStack_20,reader);
    break;
  case 10:
    data_23 = ByteCodeReader::AsmReg3_Small(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_23,pFStack_20,reader);
    break;
  case 0xb:
    data_26 = ByteCodeReader::AsmReg4_Small(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_26,pFStack_20,reader);
    break;
  case 0xc:
    data_29 = ByteCodeReader::AsmReg5_Small(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_29,pFStack_20,reader);
    break;
  case 0xd:
    data_32 = ByteCodeReader::AsmReg6_Small(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_32,pFStack_20,reader);
    break;
  case 0xe:
    data_35 = ByteCodeReader::AsmReg7_Small(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_35,pFStack_20,reader);
    break;
  case 0xf:
    data_38 = ByteCodeReader::AsmReg9_Small(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_38,pFStack_20,reader);
    break;
  case 0x10:
    data_41 = ByteCodeReader::AsmReg10_Small(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_41,pFStack_20,reader);
    break;
  case 0x11:
    data_44 = ByteCodeReader::AsmReg11_Small(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_44,pFStack_20,reader);
    break;
  case 0x12:
    data_47 = ByteCodeReader::AsmReg17_Small(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_47,pFStack_20,reader);
    break;
  case 0x13:
    data_50 = ByteCodeReader::AsmReg18_Small(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_50,pFStack_20,reader);
    break;
  case 0x14:
    data_53 = ByteCodeReader::AsmReg19_Small(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_53,pFStack_20,reader);
    break;
  case 0x15:
    data_56 = ByteCodeReader::Int1Double1_Small(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_56,pFStack_20,reader);
    break;
  case 0x16:
    data_59 = ByteCodeReader::Int1Float1_Small(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_59,pFStack_20,reader);
    break;
  case 0x17:
    data_62 = ByteCodeReader::Double1Const1_Small(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_62,pFStack_20,reader);
    break;
  case 0x18:
    data_65 = ByteCodeReader::Double1Int1_Small(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_65,pFStack_20,reader);
    break;
  case 0x19:
    data_68 = ByteCodeReader::Double1Float1_Small(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_68,pFStack_20,reader);
    break;
  case 0x1a:
    data_71 = ByteCodeReader::Double1Reg1_Small(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_71,pFStack_20,reader);
    break;
  case 0x1b:
    data_74 = ByteCodeReader::Float1Reg1_Small(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_74,pFStack_20,reader);
    break;
  case 0x1c:
    data_77 = ByteCodeReader::Int1Reg1_Small(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_77,pFStack_20,reader);
    break;
  case 0x1d:
    data_80 = ByteCodeReader::Reg1Double1_Small(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_80,pFStack_20,reader);
    break;
  case 0x1e:
    data_83 = ByteCodeReader::Reg1Float1_Small(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_83,pFStack_20,reader);
    break;
  case 0x1f:
    data_86 = ByteCodeReader::Reg1Int1_Small(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_86,pFStack_20,reader);
    break;
  case 0x20:
    data_89 = ByteCodeReader::Int1Const1_Small(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_89,pFStack_20,reader);
    break;
  case 0x21:
    data_92 = ByteCodeReader::Reg1IntConst1_Small(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_92,pFStack_20,reader);
    break;
  case 0x22:
    data_95 = ByteCodeReader::Int1Double2_Small(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_95,pFStack_20,reader);
    break;
  case 0x23:
    data_98 = ByteCodeReader::Int1Float2_Small(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_98,pFStack_20,reader);
    break;
  case 0x24:
    data_x00101 = ByteCodeReader::Int2_Small(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00101,pFStack_20,reader);
    break;
  case 0x25:
    data_x00104 = ByteCodeReader::Int3_Small(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00104,pFStack_20,reader);
    break;
  case 0x26:
    data_x00107 = ByteCodeReader::Double2_Small(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00107,pFStack_20,reader);
    break;
  case 0x27:
    data_x00110 = ByteCodeReader::Float2_Small(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00110,pFStack_20,reader);
    break;
  case 0x28:
    data_x00113 = ByteCodeReader::Float3_Small(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00113,pFStack_20,reader);
    break;
  case 0x29:
    data_x00116 = ByteCodeReader::Float1Const1_Small(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00116,pFStack_20,reader);
    break;
  case 0x2a:
    data_x00119 = ByteCodeReader::Float1Double1_Small(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00119,pFStack_20,reader);
    break;
  case 0x2b:
    data_x00122 = ByteCodeReader::Float1Int1_Small(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00122,pFStack_20,reader);
    break;
  case 0x2c:
    data_x00125 = ByteCodeReader::Double3_Small(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00125,pFStack_20,reader);
    break;
  case 0x2d:
    data_x00128 = ByteCodeReader::BrInt1_Small(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00128,pFStack_20,reader);
    break;
  case 0x2e:
    data_x00131 = ByteCodeReader::BrInt2_Small(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00131,pFStack_20,reader);
    break;
  case 0x2f:
    data_x00134 = ByteCodeReader::BrInt1Const1_Small(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00134,pFStack_20,reader);
    break;
  case 0x30:
    data_x00137 = ByteCodeReader::AsmUnsigned1_Small(reader);
    DumpAsmUnsigned1<Js::OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00137,pFStack_20,reader);
    break;
  case 0x31:
    data_x00140 = ByteCodeReader::WasmLoopStart_Small(reader);
    DumpWasmLoopStart<Js::OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00140,pFStack_20,reader);
    break;
  case 0x32:
    data_x00143 = ByteCodeReader::Long1Reg1_Small(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00143,pFStack_20,reader);
    break;
  case 0x33:
    data_x00146 = ByteCodeReader::Reg1Long1_Small(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00146,pFStack_20,reader);
    break;
  case 0x34:
    data_x00149 = ByteCodeReader::Long1Const1_Small(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00149,pFStack_20,reader);
    break;
  case 0x35:
    data_x00152 = ByteCodeReader::Long2_Small(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00152,pFStack_20,reader);
    break;
  case 0x36:
    data_x00155 = ByteCodeReader::Long3_Small(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00155,pFStack_20,reader);
    break;
  case 0x37:
    data_x00158 = ByteCodeReader::Int1Long2_Small(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00158,pFStack_20,reader);
    break;
  case 0x38:
    data_x00161 = ByteCodeReader::Long1Int1_Small(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00161,pFStack_20,reader);
    break;
  case 0x39:
    data_x00164 = ByteCodeReader::Int1Long1_Small(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00164,pFStack_20,reader);
    break;
  case 0x3a:
    data_x00167 = ByteCodeReader::Long1Float1_Small(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00167,pFStack_20,reader);
    break;
  case 0x3b:
    data_x00170 = ByteCodeReader::Float1Long1_Small(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00170,pFStack_20,reader);
    break;
  case 0x3c:
    data_x00173 = ByteCodeReader::Long1Double1_Small(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00173,pFStack_20,reader);
    break;
  case 0x3d:
    data_x00176 = ByteCodeReader::Double1Long1_Small(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00176,pFStack_20,reader);
    break;
  case 0x3e:
    data_x00179 = ByteCodeReader::Float32x4_2_Small(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00179,pFStack_20,reader);
    break;
  case 0x3f:
    data_x00182 = ByteCodeReader::Float32x4_3_Small(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00182,pFStack_20,reader);
    break;
  case 0x40:
    data_x00185 = ByteCodeReader::Float32x4_4_Small(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00185,pFStack_20,reader);
    break;
  case 0x41:
    data_x00188 = ByteCodeReader::Bool32x4_1Float32x4_2_Small(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00188,pFStack_20,reader);
    break;
  case 0x42:
    data_x00191 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Small(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00191,pFStack_20,reader);
    break;
  case 0x43:
    data_x00194 = ByteCodeReader::Float32x4_1Float4_Small(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00194,pFStack_20,reader);
    break;
  case 0x44:
    data_x00197 = ByteCodeReader::Float32x4_2Int4_Small(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00197,pFStack_20,reader);
    break;
  case 0x45:
    data_x00200 = ByteCodeReader::Float32x4_3Int4_Small(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00200,pFStack_20,reader);
    break;
  case 0x46:
    data_x00203 = ByteCodeReader::Float32x4_1Float1_Small(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00203,pFStack_20,reader);
    break;
  case 0x47:
    data_x00206 = ByteCodeReader::Float32x4_2Float1_Small(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00206,pFStack_20,reader);
    break;
  case 0x48:
    data_x00209 = ByteCodeReader::Float32x4_1Int32x4_1_Small(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00209,pFStack_20,reader);
    break;
  case 0x49:
    data_x00212 = ByteCodeReader::Float32x4_1Uint32x4_1_Small(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00212,pFStack_20,reader);
    break;
  case 0x4a:
    data_x00215 = ByteCodeReader::Float32x4_1Int16x8_1_Small(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00215,pFStack_20,reader);
    break;
  case 0x4b:
    data_x00218 = ByteCodeReader::Float32x4_1Uint16x8_1_Small(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00218,pFStack_20,reader);
    break;
  case 0x4c:
    data_x00221 = ByteCodeReader::Float32x4_1Int8x16_1_Small(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00221,pFStack_20,reader);
    break;
  case 0x4d:
    data_x00224 = ByteCodeReader::Float32x4_1Uint8x16_1_Small(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00224,pFStack_20,reader);
    break;
  case 0x4e:
    data_x00227 = ByteCodeReader::Reg1Float32x4_1_Small(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00227,pFStack_20,reader);
    break;
  case 0x4f:
    data_x00230 = ByteCodeReader::Float1Float32x4_1Int1_Small(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00230,pFStack_20,reader);
    break;
  case 0x50:
    data_x00233 = ByteCodeReader::Float32x4_2Int1Float1_Small(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00233,pFStack_20,reader);
    break;
  case 0x51:
    data_x00236 = ByteCodeReader::Int32x4_2_Small(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00236,pFStack_20,reader);
    break;
  case 0x52:
    data_x00239 = ByteCodeReader::Int32x4_3_Small(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00239,pFStack_20,reader);
    break;
  case 0x53:
    data_x00242 = ByteCodeReader::Int32x4_4_Small(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00242,pFStack_20,reader);
    break;
  case 0x54:
    data_x00245 = ByteCodeReader::Bool32x4_1Int32x4_2_Small(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00245,pFStack_20,reader);
    break;
  case 0x55:
    data_x00248 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Small(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00248,pFStack_20,reader);
    break;
  case 0x56:
    data_x00251 = ByteCodeReader::Int32x4_1Int4_Small(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00251,pFStack_20,reader);
    break;
  case 0x57:
    data_x00254 = ByteCodeReader::Int32x4_2Int4_Small(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00254,pFStack_20,reader);
    break;
  case 0x58:
    data_x00257 = ByteCodeReader::Int32x4_3Int4_Small(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00257,pFStack_20,reader);
    break;
  case 0x59:
    data_x00260 = ByteCodeReader::Int32x4_1Int1_Small(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00260,pFStack_20,reader);
    break;
  case 0x5a:
    data_x00263 = ByteCodeReader::Int32x4_2Int1_Small(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00263,pFStack_20,reader);
    break;
  case 0x5b:
    data_x00266 = ByteCodeReader::Reg1Int32x4_1_Small(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00266,pFStack_20,reader);
    break;
  case 0x5c:
    data_x00269 = ByteCodeReader::Int32x4_1Float32x4_1_Small(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00269,pFStack_20,reader);
    break;
  case 0x5d:
    data_x00272 = ByteCodeReader::Int32x4_1Uint32x4_1_Small(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00272,pFStack_20,reader);
    break;
  case 0x5e:
    data_x00275 = ByteCodeReader::Int32x4_1Int16x8_1_Small(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00275,pFStack_20,reader);
    break;
  case 0x5f:
    data_x00278 = ByteCodeReader::Int32x4_1Uint16x8_1_Small(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00278,pFStack_20,reader);
    break;
  case 0x60:
    data_x00281 = ByteCodeReader::Int32x4_1Int8x16_1_Small(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00281,pFStack_20,reader);
    break;
  case 0x61:
    data_x00284 = ByteCodeReader::Int32x4_1Uint8x16_1_Small(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00284,pFStack_20,reader);
    break;
  case 0x62:
    data_x00287 = ByteCodeReader::Int1Int32x4_1Int1_Small(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00287,pFStack_20,reader);
    break;
  case 99:
    data_x00290 = ByteCodeReader::Int32x4_2Int2_Small(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00290,pFStack_20,reader);
    break;
  case 100:
    data_x00293 = ByteCodeReader::Float32x4_IntConst4_Small(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00293,pFStack_20,reader);
    break;
  case 0x65:
    data_x00296 = ByteCodeReader::Double1Float64x2_1Int1_Small(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00296,pFStack_20,reader);
    break;
  case 0x66:
    data_x00299 = ByteCodeReader::Float64x2_2Int1Double1_Small(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00299,pFStack_20,reader);
    break;
  case 0x67:
    data_x00302 = ByteCodeReader::Float64x2_2_Small(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00302,pFStack_20,reader);
    break;
  case 0x68:
    data_x00305 = ByteCodeReader::Float64x2_3_Small(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00305,pFStack_20,reader);
    break;
  case 0x69:
    data_x00308 = ByteCodeReader::Float64x2_1Double1_Small(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00308,pFStack_20,reader);
    break;
  case 0x6a:
    data_x00311 = ByteCodeReader::Int64x2_1Long1_Small(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00311,pFStack_20,reader);
    break;
  case 0x6b:
    data_x00314 = ByteCodeReader::Long1Int64x2_1Int1_Small(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00314,pFStack_20,reader);
    break;
  case 0x6c:
    data_x00317 = ByteCodeReader::Int64x2_2_Int1_Long1_Small(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00317,pFStack_20,reader);
    break;
  case 0x6d:
    data_x00320 = ByteCodeReader::Int64x2_3_Small(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00320,pFStack_20,reader);
    break;
  case 0x6e:
    data_x00323 = ByteCodeReader::Int64x2_2_Small(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00323,pFStack_20,reader);
    break;
  case 0x6f:
    data_x00326 = ByteCodeReader::Int64x2_2Int1_Small(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00326,pFStack_20,reader);
    break;
  case 0x70:
    data_x00329 = ByteCodeReader::Int1Bool64x2_1_Small(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00329,pFStack_20,reader);
    break;
  case 0x71:
    data_x00332 = ByteCodeReader::Int16x8_1Int8_Small(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00332,pFStack_20,reader);
    break;
  case 0x72:
    data_x00335 = ByteCodeReader::Reg1Int16x8_1_Small(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00335,pFStack_20,reader);
    break;
  case 0x73:
    data_x00338 = ByteCodeReader::Int16x8_2_Small(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00338,pFStack_20,reader);
    break;
  case 0x74:
    data_x00341 = ByteCodeReader::Int1Int16x8_1Int1_Small(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00341,pFStack_20,reader);
    break;
  case 0x75:
    data_x00344 = ByteCodeReader::Int16x8_2Int8_Small(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00344,pFStack_20,reader);
    break;
  case 0x76:
    data_x00347 = ByteCodeReader::Int16x8_3Int8_Small(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00347,pFStack_20,reader);
    break;
  case 0x77:
    data_x00350 = ByteCodeReader::Int16x8_1Int1_Small(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00350,pFStack_20,reader);
    break;
  case 0x78:
    data_x00353 = ByteCodeReader::Int16x8_2Int2_Small(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00353,pFStack_20,reader);
    break;
  case 0x79:
    data_x00356 = ByteCodeReader::Int16x8_3_Small(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00356,pFStack_20,reader);
    break;
  case 0x7a:
    data_x00359 = ByteCodeReader::Bool16x8_1Int16x8_2_Small(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00359,pFStack_20,reader);
    break;
  case 0x7b:
    data_x00362 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Small(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00362,pFStack_20,reader);
    break;
  case 0x7c:
    data_x00365 = ByteCodeReader::Int16x8_2Int1_Small(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00365,pFStack_20,reader);
    break;
  case 0x7d:
    data_x00368 = ByteCodeReader::Int16x8_1Float32x4_1_Small(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00368,pFStack_20,reader);
    break;
  case 0x7e:
    data_x00371 = ByteCodeReader::Int16x8_1Int32x4_1_Small(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00371,pFStack_20,reader);
    break;
  case 0x7f:
    data_x00374 = ByteCodeReader::Int16x8_1Int8x16_1_Small(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00374,pFStack_20,reader);
    break;
  case 0x80:
    data_x00377 = ByteCodeReader::Int16x8_1Uint32x4_1_Small(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00377,pFStack_20,reader);
    break;
  case 0x81:
    data_x00380 = ByteCodeReader::Int16x8_1Uint16x8_1_Small(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00380,pFStack_20,reader);
    break;
  case 0x82:
    data_x00383 = ByteCodeReader::Int16x8_1Uint8x16_1_Small(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00383,pFStack_20,reader);
    break;
  case 0x83:
    data_x00386 = ByteCodeReader::Int8x16_2_Small(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00386,pFStack_20,reader);
    break;
  case 0x84:
    data_x00389 = ByteCodeReader::Int8x16_3_Small(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00389,pFStack_20,reader);
    break;
  case 0x85:
    data_x00392 = ByteCodeReader::Int8x16_1Int16_Small(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00392,pFStack_20,reader);
    break;
  case 0x86:
    data_x00395 = ByteCodeReader::Int8x16_2Int16_Small(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00395,pFStack_20,reader);
    break;
  case 0x87:
    data_x00398 = ByteCodeReader::Int8x16_3Int16_Small(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00398,pFStack_20,reader);
    break;
  case 0x88:
    data_x00401 = ByteCodeReader::Int8x16_1Int1_Small(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00401,pFStack_20,reader);
    break;
  case 0x89:
    data_x00404 = ByteCodeReader::Int8x16_2Int1_Small(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00404,pFStack_20,reader);
    break;
  case 0x8a:
    data_x00407 = ByteCodeReader::Reg1Int8x16_1_Small(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00407,pFStack_20,reader);
    break;
  case 0x8b:
    data_x00410 = ByteCodeReader::Bool8x16_1Int8x16_2_Small(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00410,pFStack_20,reader);
    break;
  case 0x8c:
    data_x00413 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Small(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00413,pFStack_20,reader);
    break;
  case 0x8d:
    data_x00416 = ByteCodeReader::Int8x16_1Float32x4_1_Small(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00416,pFStack_20,reader);
    break;
  case 0x8e:
    data_x00419 = ByteCodeReader::Int8x16_1Int32x4_1_Small(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00419,pFStack_20,reader);
    break;
  case 0x8f:
    data_x00422 = ByteCodeReader::Int8x16_1Int16x8_1_Small(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00422,pFStack_20,reader);
    break;
  case 0x90:
    data_x00425 = ByteCodeReader::Int8x16_1Uint32x4_1_Small(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00425,pFStack_20,reader);
    break;
  case 0x91:
    data_x00428 = ByteCodeReader::Int8x16_1Uint16x8_1_Small(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00428,pFStack_20,reader);
    break;
  case 0x92:
    data_x00431 = ByteCodeReader::Int8x16_1Uint8x16_1_Small(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00431,pFStack_20,reader);
    break;
  case 0x93:
    data_x00434 = ByteCodeReader::Int1Int8x16_1Int1_Small(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00434,pFStack_20,reader);
    break;
  case 0x94:
    data_x00437 = ByteCodeReader::Int8x16_2Int2_Small(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00437,pFStack_20,reader);
    break;
  case 0x95:
    data_x00440 = ByteCodeReader::Uint32x4_1Int4_Small(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00440,pFStack_20,reader);
    break;
  case 0x96:
    data_x00443 = ByteCodeReader::Reg1Uint32x4_1_Small(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00443,pFStack_20,reader);
    break;
  case 0x97:
    data_x00446 = ByteCodeReader::Uint32x4_2_Small(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00446,pFStack_20,reader);
    break;
  case 0x98:
    data_x00449 = ByteCodeReader::Int1Uint32x4_1Int1_Small(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00449,pFStack_20,reader);
    break;
  case 0x99:
    data_x00452 = ByteCodeReader::Uint32x4_2Int4_Small(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00452,pFStack_20,reader);
    break;
  case 0x9a:
    data_x00455 = ByteCodeReader::Uint32x4_3Int4_Small(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00455,pFStack_20,reader);
    break;
  case 0x9b:
    data_x00458 = ByteCodeReader::Uint32x4_1Int1_Small(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00458,pFStack_20,reader);
    break;
  case 0x9c:
    data_x00461 = ByteCodeReader::Uint32x4_2Int2_Small(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00461,pFStack_20,reader);
    break;
  case 0x9d:
    data_x00464 = ByteCodeReader::Uint32x4_3_Small(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00464,pFStack_20,reader);
    break;
  case 0x9e:
    data_x00467 = ByteCodeReader::Bool32x4_1Uint32x4_2_Small(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00467,pFStack_20,reader);
    break;
  case 0x9f:
    data_x00470 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Small(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00470,pFStack_20,reader);
    break;
  case 0xa0:
    data_x00473 = ByteCodeReader::Uint32x4_2Int1_Small(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00473,pFStack_20,reader);
    break;
  case 0xa1:
    data_x00476 = ByteCodeReader::Uint32x4_1Float32x4_1_Small(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00476,pFStack_20,reader);
    break;
  case 0xa2:
    data_x00479 = ByteCodeReader::Uint32x4_1Int32x4_1_Small(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00479,pFStack_20,reader);
    break;
  case 0xa3:
    data_x00482 = ByteCodeReader::Uint32x4_1Int16x8_1_Small(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00482,pFStack_20,reader);
    break;
  case 0xa4:
    data_x00485 = ByteCodeReader::Uint32x4_1Int8x16_1_Small(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00485,pFStack_20,reader);
    break;
  case 0xa5:
    data_x00488 = ByteCodeReader::Uint32x4_1Uint16x8_1_Small(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00488,pFStack_20,reader);
    break;
  case 0xa6:
    data_x00491 = ByteCodeReader::Uint32x4_1Uint8x16_1_Small(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00491,pFStack_20,reader);
    break;
  case 0xa7:
    data_x00494 = ByteCodeReader::Uint16x8_1Int8_Small(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00494,pFStack_20,reader);
    break;
  case 0xa8:
    data_x00497 = ByteCodeReader::Reg1Uint16x8_1_Small(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00497,pFStack_20,reader);
    break;
  case 0xa9:
    data_x00500 = ByteCodeReader::Uint16x8_2_Small(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00500,pFStack_20,reader);
    break;
  case 0xaa:
    data_x00503 = ByteCodeReader::Int1Uint16x8_1Int1_Small(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00503,pFStack_20,reader);
    break;
  case 0xab:
    data_x00506 = ByteCodeReader::Uint16x8_2Int8_Small(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00506,pFStack_20,reader);
    break;
  case 0xac:
    data_x00509 = ByteCodeReader::Uint16x8_3Int8_Small(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00509,pFStack_20,reader);
    break;
  case 0xad:
    data_x00512 = ByteCodeReader::Uint16x8_1Int1_Small(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00512,pFStack_20,reader);
    break;
  case 0xae:
    data_x00515 = ByteCodeReader::Uint16x8_2Int2_Small(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00515,pFStack_20,reader);
    break;
  case 0xaf:
    data_x00518 = ByteCodeReader::Uint16x8_3_Small(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00518,pFStack_20,reader);
    break;
  case 0xb0:
    data_x00521 = ByteCodeReader::Bool16x8_1Uint16x8_2_Small(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00521,pFStack_20,reader);
    break;
  case 0xb1:
    data_x00524 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Small(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00524,pFStack_20,reader);
    break;
  case 0xb2:
    data_x00527 = ByteCodeReader::Uint16x8_2Int1_Small(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00527,pFStack_20,reader);
    break;
  case 0xb3:
    data_x00530 = ByteCodeReader::Uint16x8_1Float32x4_1_Small(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00530,pFStack_20,reader);
    break;
  case 0xb4:
    data_x00533 = ByteCodeReader::Uint16x8_1Int32x4_1_Small(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00533,pFStack_20,reader);
    break;
  case 0xb5:
    data_x00536 = ByteCodeReader::Uint16x8_1Int16x8_1_Small(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00536,pFStack_20,reader);
    break;
  case 0xb6:
    data_x00539 = ByteCodeReader::Uint16x8_1Int8x16_1_Small(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00539,pFStack_20,reader);
    break;
  case 0xb7:
    data_x00542 = ByteCodeReader::Uint16x8_1Uint32x4_1_Small(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00542,pFStack_20,reader);
    break;
  case 0xb8:
    data_x00545 = ByteCodeReader::Uint16x8_1Uint8x16_1_Small(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00545,pFStack_20,reader);
    break;
  case 0xb9:
    data_x00548 = ByteCodeReader::Uint8x16_1Int16_Small(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00548,pFStack_20,reader);
    break;
  case 0xba:
    data_x00551 = ByteCodeReader::Reg1Uint8x16_1_Small(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00551,pFStack_20,reader);
    break;
  case 0xbb:
    data_x00554 = ByteCodeReader::Uint8x16_2_Small(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00554,pFStack_20,reader);
    break;
  case 0xbc:
    data_x00557 = ByteCodeReader::Int1Uint8x16_1Int1_Small(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00557,pFStack_20,reader);
    break;
  case 0xbd:
    data_x00560 = ByteCodeReader::Uint8x16_2Int16_Small(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00560,pFStack_20,reader);
    break;
  case 0xbe:
    data_x00563 = ByteCodeReader::Uint8x16_3Int16_Small(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00563,pFStack_20,reader);
    break;
  case 0xbf:
    data_x00566 = ByteCodeReader::Uint8x16_1Int1_Small(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00566,pFStack_20,reader);
    break;
  case 0xc0:
    data_x00569 = ByteCodeReader::Uint8x16_2Int2_Small(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00569,pFStack_20,reader);
    break;
  case 0xc1:
    data_x00572 = ByteCodeReader::Uint8x16_3_Small(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00572,pFStack_20,reader);
    break;
  case 0xc2:
    data_x00575 = ByteCodeReader::Bool8x16_1Uint8x16_2_Small(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00575,pFStack_20,reader);
    break;
  case 0xc3:
    data_x00578 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Small(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00578,pFStack_20,reader);
    break;
  case 0xc4:
    data_x00581 = ByteCodeReader::Uint8x16_2Int1_Small(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00581,pFStack_20,reader);
    break;
  case 0xc5:
    data_x00584 = ByteCodeReader::Uint8x16_1Float32x4_1_Small(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00584,pFStack_20,reader);
    break;
  case 0xc6:
    data_x00587 = ByteCodeReader::Uint8x16_1Int32x4_1_Small(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00587,pFStack_20,reader);
    break;
  case 199:
    data_x00590 = ByteCodeReader::Uint8x16_1Int16x8_1_Small(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00590,pFStack_20,reader);
    break;
  case 200:
    data_x00593 = ByteCodeReader::Uint8x16_1Int8x16_1_Small(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00593,pFStack_20,reader);
    break;
  case 0xc9:
    data_x00596 = ByteCodeReader::Uint8x16_1Uint32x4_1_Small(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00596,pFStack_20,reader);
    break;
  case 0xca:
    data_x00599 = ByteCodeReader::Uint8x16_1Uint16x8_1_Small(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00599,pFStack_20,reader);
    break;
  case 0xcb:
    data_x00602 = ByteCodeReader::Bool32x4_1Int1_Small(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00602,pFStack_20,reader);
    break;
  case 0xcc:
    data_x00605 = ByteCodeReader::Bool32x4_1Int4_Small(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00605,pFStack_20,reader);
    break;
  case 0xcd:
    data_x00608 = ByteCodeReader::Int1Bool32x4_1Int1_Small(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00608,pFStack_20,reader);
    break;
  case 0xce:
    data_x00611 = ByteCodeReader::Bool32x4_2Int2_Small(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00611,pFStack_20,reader);
    break;
  case 0xcf:
    data_x00614 = ByteCodeReader::Int1Bool32x4_1_Small(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00614,pFStack_20,reader);
    break;
  case 0xd0:
    data_x00617 = ByteCodeReader::Bool32x4_2_Small(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00617,pFStack_20,reader);
    break;
  case 0xd1:
    data_x00620 = ByteCodeReader::Bool32x4_3_Small(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00620,pFStack_20,reader);
    break;
  case 0xd2:
    data_x00623 = ByteCodeReader::Reg1Bool32x4_1_Small(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00623,pFStack_20,reader);
    break;
  case 0xd3:
    data_x00626 = ByteCodeReader::Bool16x8_1Int1_Small(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00626,pFStack_20,reader);
    break;
  case 0xd4:
    data_x00629 = ByteCodeReader::Bool16x8_1Int8_Small(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00629,pFStack_20,reader);
    break;
  case 0xd5:
    data_x00632 = ByteCodeReader::Int1Bool16x8_1Int1_Small(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00632,pFStack_20,reader);
    break;
  case 0xd6:
    data_x00635 = ByteCodeReader::Bool16x8_2Int2_Small(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00635,pFStack_20,reader);
    break;
  case 0xd7:
    data_x00638 = ByteCodeReader::Int1Bool16x8_1_Small(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00638,pFStack_20,reader);
    break;
  case 0xd8:
    data_x00641 = ByteCodeReader::Bool16x8_2_Small(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00641,pFStack_20,reader);
    break;
  case 0xd9:
    data_x00644 = ByteCodeReader::Bool16x8_3_Small(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00644,pFStack_20,reader);
    break;
  case 0xda:
    data_x00647 = ByteCodeReader::Reg1Bool16x8_1_Small(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00647,pFStack_20,reader);
    break;
  case 0xdb:
    data_x00650 = ByteCodeReader::Bool8x16_1Int1_Small(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00650,pFStack_20,reader);
    break;
  case 0xdc:
    data_x00653 = ByteCodeReader::Bool8x16_1Int16_Small(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00653,pFStack_20,reader);
    break;
  case 0xdd:
    data_x00656 = ByteCodeReader::Int1Bool8x16_1_Small(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00656,pFStack_20,reader);
    break;
  case 0xde:
    data_x00659 = ByteCodeReader::Int1Bool8x16_1Int1_Small(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00659,pFStack_20,reader);
    break;
  case 0xdf:
    data_x00662 = ByteCodeReader::Bool8x16_2Int2_Small(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00662,pFStack_20,reader);
    break;
  case 0xe0:
    data_x00665 = ByteCodeReader::Bool8x16_2_Small(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00665,pFStack_20,reader);
    break;
  case 0xe1:
    data_x00668 = ByteCodeReader::Bool8x16_3_Small(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00668,pFStack_20,reader);
    break;
  case 0xe2:
    data_x00671 = ByteCodeReader::Reg1Bool8x16_1_Small(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00671,pFStack_20,reader);
    break;
  case 0xe3:
    data_x00674 = ByteCodeReader::AsmSimdTypedArr_Small(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00674,pFStack_20,reader);
    break;
  case 0xe4:
    data_x00677 = ByteCodeReader::AsmShuffle_Small(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
              (op,data_x00677,pFStack_20,reader);
    break;
  case 0xe5:
    data_00 = ByteCodeReader::ElementSlot_Medium(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_00,pFStack_20,reader);
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                ,0x11d,"(false)","Unknown OpLayout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    break;
  case 0xe8:
    data_05 = ByteCodeReader::AsmTypedArr_Medium(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_05,pFStack_20,reader);
    break;
  case 0xe9:
    data_08 = ByteCodeReader::WasmMemAccess_Medium(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_08,pFStack_20,reader);
    break;
  case 0xea:
    data_11 = ByteCodeReader::AsmCall_Medium(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_11,pFStack_20,reader);
    break;
  case 0xeb:
    data_14 = ByteCodeReader::ProfiledAsmCall_Medium(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
              (op,data_14,pFStack_20,reader);
    break;
  case 0xed:
    data_18 = ByteCodeReader::AsmReg1_Medium(reader);
    DumpAsmReg1<Js::OpLayoutT_AsmReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_18,pFStack_20,reader);
    break;
  case 0xee:
    data_21 = ByteCodeReader::AsmReg2_Medium(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_21,pFStack_20,reader);
    break;
  case 0xef:
    data_24 = ByteCodeReader::AsmReg3_Medium(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_24,pFStack_20,reader);
    break;
  case 0xf0:
    data_27 = ByteCodeReader::AsmReg4_Medium(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_27,pFStack_20,reader);
    break;
  case 0xf1:
    data_30 = ByteCodeReader::AsmReg5_Medium(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_30,pFStack_20,reader);
    break;
  case 0xf2:
    data_33 = ByteCodeReader::AsmReg6_Medium(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_33,pFStack_20,reader);
    break;
  case 0xf3:
    data_36 = ByteCodeReader::AsmReg7_Medium(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_36,pFStack_20,reader);
    break;
  case 0xf4:
    data_39 = ByteCodeReader::AsmReg9_Medium(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_39,pFStack_20,reader);
    break;
  case 0xf5:
    data_42 = ByteCodeReader::AsmReg10_Medium(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_42,pFStack_20,reader);
    break;
  case 0xf6:
    data_45 = ByteCodeReader::AsmReg11_Medium(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_45,pFStack_20,reader);
    break;
  case 0xf7:
    data_48 = ByteCodeReader::AsmReg17_Medium(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_48,pFStack_20,reader);
    break;
  case 0xf8:
    data_51 = ByteCodeReader::AsmReg18_Medium(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_51,pFStack_20,reader);
    break;
  case 0xf9:
    data_54 = ByteCodeReader::AsmReg19_Medium(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_54,pFStack_20,reader);
    break;
  case 0xfa:
    data_57 = ByteCodeReader::Int1Double1_Medium(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_57,pFStack_20,reader);
    break;
  case 0xfb:
    data_60 = ByteCodeReader::Int1Float1_Medium(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_60,pFStack_20,reader);
    break;
  case 0xfc:
    data_63 = ByteCodeReader::Double1Const1_Medium(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_63,pFStack_20,reader);
    break;
  case 0xfd:
    data_66 = ByteCodeReader::Double1Int1_Medium(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_66,pFStack_20,reader);
    break;
  case 0xfe:
    data_69 = ByteCodeReader::Double1Float1_Medium(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_69,pFStack_20,reader);
    break;
  case 0xff:
    data_72 = ByteCodeReader::Double1Reg1_Medium(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_72,pFStack_20,reader);
    break;
  case 0x100:
    data_75 = ByteCodeReader::Float1Reg1_Medium(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_75,pFStack_20,reader);
    break;
  case 0x101:
    data_78 = ByteCodeReader::Int1Reg1_Medium(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_78,pFStack_20,reader);
    break;
  case 0x102:
    data_81 = ByteCodeReader::Reg1Double1_Medium(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_81,pFStack_20,reader);
    break;
  case 0x103:
    data_84 = ByteCodeReader::Reg1Float1_Medium(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_84,pFStack_20,reader);
    break;
  case 0x104:
    data_87 = ByteCodeReader::Reg1Int1_Medium(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_87,pFStack_20,reader);
    break;
  case 0x105:
    data_90 = ByteCodeReader::Int1Const1_Medium(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_90,pFStack_20,reader);
    break;
  case 0x106:
    data_93 = ByteCodeReader::Reg1IntConst1_Medium(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_93,pFStack_20,reader);
    break;
  case 0x107:
    data_96 = ByteCodeReader::Int1Double2_Medium(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_96,pFStack_20,reader);
    break;
  case 0x108:
    data_99 = ByteCodeReader::Int1Float2_Medium(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_99,pFStack_20,reader);
    break;
  case 0x109:
    data_x00102 = ByteCodeReader::Int2_Medium(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00102,pFStack_20,reader);
    break;
  case 0x10a:
    data_x00105 = ByteCodeReader::Int3_Medium(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00105,pFStack_20,reader);
    break;
  case 0x10b:
    data_x00108 = ByteCodeReader::Double2_Medium(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00108,pFStack_20,reader);
    break;
  case 0x10c:
    data_x00111 = ByteCodeReader::Float2_Medium(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00111,pFStack_20,reader);
    break;
  case 0x10d:
    data_x00114 = ByteCodeReader::Float3_Medium(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00114,pFStack_20,reader);
    break;
  case 0x10e:
    data_x00117 = ByteCodeReader::Float1Const1_Medium(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00117,pFStack_20,reader);
    break;
  case 0x10f:
    data_x00120 = ByteCodeReader::Float1Double1_Medium(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00120,pFStack_20,reader);
    break;
  case 0x110:
    data_x00123 = ByteCodeReader::Float1Int1_Medium(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00123,pFStack_20,reader);
    break;
  case 0x111:
    data_x00126 = ByteCodeReader::Double3_Medium(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00126,pFStack_20,reader);
    break;
  case 0x112:
    data_x00129 = ByteCodeReader::BrInt1_Medium(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00129,pFStack_20,reader);
    break;
  case 0x113:
    data_x00132 = ByteCodeReader::BrInt2_Medium(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00132,pFStack_20,reader);
    break;
  case 0x114:
    data_x00135 = ByteCodeReader::BrInt1Const1_Medium(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00135,pFStack_20,reader);
    break;
  case 0x115:
    data_x00138 = ByteCodeReader::AsmUnsigned1_Medium(reader);
    DumpAsmUnsigned1<Js::OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00138,pFStack_20,reader);
    break;
  case 0x116:
    data_x00141 = ByteCodeReader::WasmLoopStart_Medium(reader);
    DumpWasmLoopStart<Js::OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00141,pFStack_20,reader);
    break;
  case 0x117:
    data_x00144 = ByteCodeReader::Long1Reg1_Medium(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00144,pFStack_20,reader);
    break;
  case 0x118:
    data_x00147 = ByteCodeReader::Reg1Long1_Medium(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00147,pFStack_20,reader);
    break;
  case 0x119:
    data_x00150 = ByteCodeReader::Long1Const1_Medium(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00150,pFStack_20,reader);
    break;
  case 0x11a:
    data_x00153 = ByteCodeReader::Long2_Medium(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00153,pFStack_20,reader);
    break;
  case 0x11b:
    data_x00156 = ByteCodeReader::Long3_Medium(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00156,pFStack_20,reader);
    break;
  case 0x11c:
    data_x00159 = ByteCodeReader::Int1Long2_Medium(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00159,pFStack_20,reader);
    break;
  case 0x11d:
    data_x00162 = ByteCodeReader::Long1Int1_Medium(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00162,pFStack_20,reader);
    break;
  case 0x11e:
    data_x00165 = ByteCodeReader::Int1Long1_Medium(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00165,pFStack_20,reader);
    break;
  case 0x11f:
    data_x00168 = ByteCodeReader::Long1Float1_Medium(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00168,pFStack_20,reader);
    break;
  case 0x120:
    data_x00171 = ByteCodeReader::Float1Long1_Medium(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00171,pFStack_20,reader);
    break;
  case 0x121:
    data_x00174 = ByteCodeReader::Long1Double1_Medium(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00174,pFStack_20,reader);
    break;
  case 0x122:
    data_x00177 = ByteCodeReader::Double1Long1_Medium(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00177,pFStack_20,reader);
    break;
  case 0x123:
    data_x00180 = ByteCodeReader::Float32x4_2_Medium(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00180,pFStack_20,reader);
    break;
  case 0x124:
    data_x00183 = ByteCodeReader::Float32x4_3_Medium(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00183,pFStack_20,reader);
    break;
  case 0x125:
    data_x00186 = ByteCodeReader::Float32x4_4_Medium(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00186,pFStack_20,reader);
    break;
  case 0x126:
    data_x00189 = ByteCodeReader::Bool32x4_1Float32x4_2_Medium(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00189,pFStack_20,reader);
    break;
  case 0x127:
    data_x00192 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Medium(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00192,pFStack_20,reader);
    break;
  case 0x128:
    data_x00195 = ByteCodeReader::Float32x4_1Float4_Medium(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00195,pFStack_20,reader);
    break;
  case 0x129:
    data_x00198 = ByteCodeReader::Float32x4_2Int4_Medium(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00198,pFStack_20,reader);
    break;
  case 0x12a:
    data_x00201 = ByteCodeReader::Float32x4_3Int4_Medium(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00201,pFStack_20,reader);
    break;
  case 299:
    data_x00204 = ByteCodeReader::Float32x4_1Float1_Medium(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00204,pFStack_20,reader);
    break;
  case 300:
    data_x00207 = ByteCodeReader::Float32x4_2Float1_Medium(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00207,pFStack_20,reader);
    break;
  case 0x12d:
    data_x00210 = ByteCodeReader::Float32x4_1Int32x4_1_Medium(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00210,pFStack_20,reader);
    break;
  case 0x12e:
    data_x00213 = ByteCodeReader::Float32x4_1Uint32x4_1_Medium(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00213,pFStack_20,reader);
    break;
  case 0x12f:
    data_x00216 = ByteCodeReader::Float32x4_1Int16x8_1_Medium(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00216,pFStack_20,reader);
    break;
  case 0x130:
    data_x00219 = ByteCodeReader::Float32x4_1Uint16x8_1_Medium(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00219,pFStack_20,reader);
    break;
  case 0x131:
    data_x00222 = ByteCodeReader::Float32x4_1Int8x16_1_Medium(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00222,pFStack_20,reader);
    break;
  case 0x132:
    data_x00225 = ByteCodeReader::Float32x4_1Uint8x16_1_Medium(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00225,pFStack_20,reader);
    break;
  case 0x133:
    data_x00228 = ByteCodeReader::Reg1Float32x4_1_Medium(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00228,pFStack_20,reader);
    break;
  case 0x134:
    data_x00231 = ByteCodeReader::Float1Float32x4_1Int1_Medium(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00231,pFStack_20,reader);
    break;
  case 0x135:
    data_x00234 = ByteCodeReader::Float32x4_2Int1Float1_Medium(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00234,pFStack_20,reader);
    break;
  case 0x136:
    data_x00237 = ByteCodeReader::Int32x4_2_Medium(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00237,pFStack_20,reader);
    break;
  case 0x137:
    data_x00240 = ByteCodeReader::Int32x4_3_Medium(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00240,pFStack_20,reader);
    break;
  case 0x138:
    data_x00243 = ByteCodeReader::Int32x4_4_Medium(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00243,pFStack_20,reader);
    break;
  case 0x139:
    data_x00246 = ByteCodeReader::Bool32x4_1Int32x4_2_Medium(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00246,pFStack_20,reader);
    break;
  case 0x13a:
    data_x00249 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Medium(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00249,pFStack_20,reader);
    break;
  case 0x13b:
    data_x00252 = ByteCodeReader::Int32x4_1Int4_Medium(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00252,pFStack_20,reader);
    break;
  case 0x13c:
    data_x00255 = ByteCodeReader::Int32x4_2Int4_Medium(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00255,pFStack_20,reader);
    break;
  case 0x13d:
    data_x00258 = ByteCodeReader::Int32x4_3Int4_Medium(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00258,pFStack_20,reader);
    break;
  case 0x13e:
    data_x00261 = ByteCodeReader::Int32x4_1Int1_Medium(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00261,pFStack_20,reader);
    break;
  case 0x13f:
    data_x00264 = ByteCodeReader::Int32x4_2Int1_Medium(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00264,pFStack_20,reader);
    break;
  case 0x140:
    data_x00267 = ByteCodeReader::Reg1Int32x4_1_Medium(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00267,pFStack_20,reader);
    break;
  case 0x141:
    data_x00270 = ByteCodeReader::Int32x4_1Float32x4_1_Medium(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00270,pFStack_20,reader);
    break;
  case 0x142:
    data_x00273 = ByteCodeReader::Int32x4_1Uint32x4_1_Medium(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00273,pFStack_20,reader);
    break;
  case 0x143:
    data_x00276 = ByteCodeReader::Int32x4_1Int16x8_1_Medium(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00276,pFStack_20,reader);
    break;
  case 0x144:
    data_x00279 = ByteCodeReader::Int32x4_1Uint16x8_1_Medium(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00279,pFStack_20,reader);
    break;
  case 0x145:
    data_x00282 = ByteCodeReader::Int32x4_1Int8x16_1_Medium(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00282,pFStack_20,reader);
    break;
  case 0x146:
    data_x00285 = ByteCodeReader::Int32x4_1Uint8x16_1_Medium(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00285,pFStack_20,reader);
    break;
  case 0x147:
    data_x00288 = ByteCodeReader::Int1Int32x4_1Int1_Medium(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00288,pFStack_20,reader);
    break;
  case 0x148:
    data_x00291 = ByteCodeReader::Int32x4_2Int2_Medium(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00291,pFStack_20,reader);
    break;
  case 0x149:
    data_x00294 = ByteCodeReader::Float32x4_IntConst4_Medium(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00294,pFStack_20,reader);
    break;
  case 0x14a:
    data_x00297 = ByteCodeReader::Double1Float64x2_1Int1_Medium(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00297,pFStack_20,reader);
    break;
  case 0x14b:
    data_x00300 = ByteCodeReader::Float64x2_2Int1Double1_Medium(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00300,pFStack_20,reader);
    break;
  case 0x14c:
    data_x00303 = ByteCodeReader::Float64x2_2_Medium(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00303,pFStack_20,reader);
    break;
  case 0x14d:
    data_x00306 = ByteCodeReader::Float64x2_3_Medium(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00306,pFStack_20,reader);
    break;
  case 0x14e:
    data_x00309 = ByteCodeReader::Float64x2_1Double1_Medium(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00309,pFStack_20,reader);
    break;
  case 0x14f:
    data_x00312 = ByteCodeReader::Int64x2_1Long1_Medium(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00312,pFStack_20,reader);
    break;
  case 0x150:
    data_x00315 = ByteCodeReader::Long1Int64x2_1Int1_Medium(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00315,pFStack_20,reader);
    break;
  case 0x151:
    data_x00318 = ByteCodeReader::Int64x2_2_Int1_Long1_Medium(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00318,pFStack_20,reader);
    break;
  case 0x152:
    data_x00321 = ByteCodeReader::Int64x2_3_Medium(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00321,pFStack_20,reader);
    break;
  case 0x153:
    data_x00324 = ByteCodeReader::Int64x2_2_Medium(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00324,pFStack_20,reader);
    break;
  case 0x154:
    data_x00327 = ByteCodeReader::Int64x2_2Int1_Medium(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00327,pFStack_20,reader);
    break;
  case 0x155:
    data_x00330 = ByteCodeReader::Int1Bool64x2_1_Medium(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00330,pFStack_20,reader);
    break;
  case 0x156:
    data_x00333 = ByteCodeReader::Int16x8_1Int8_Medium(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00333,pFStack_20,reader);
    break;
  case 0x157:
    data_x00336 = ByteCodeReader::Reg1Int16x8_1_Medium(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00336,pFStack_20,reader);
    break;
  case 0x158:
    data_x00339 = ByteCodeReader::Int16x8_2_Medium(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00339,pFStack_20,reader);
    break;
  case 0x159:
    data_x00342 = ByteCodeReader::Int1Int16x8_1Int1_Medium(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00342,pFStack_20,reader);
    break;
  case 0x15a:
    data_x00345 = ByteCodeReader::Int16x8_2Int8_Medium(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00345,pFStack_20,reader);
    break;
  case 0x15b:
    data_x00348 = ByteCodeReader::Int16x8_3Int8_Medium(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00348,pFStack_20,reader);
    break;
  case 0x15c:
    data_x00351 = ByteCodeReader::Int16x8_1Int1_Medium(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00351,pFStack_20,reader);
    break;
  case 0x15d:
    data_x00354 = ByteCodeReader::Int16x8_2Int2_Medium(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00354,pFStack_20,reader);
    break;
  case 0x15e:
    data_x00357 = ByteCodeReader::Int16x8_3_Medium(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00357,pFStack_20,reader);
    break;
  case 0x15f:
    data_x00360 = ByteCodeReader::Bool16x8_1Int16x8_2_Medium(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00360,pFStack_20,reader);
    break;
  case 0x160:
    data_x00363 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Medium(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00363,pFStack_20,reader);
    break;
  case 0x161:
    data_x00366 = ByteCodeReader::Int16x8_2Int1_Medium(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00366,pFStack_20,reader);
    break;
  case 0x162:
    data_x00369 = ByteCodeReader::Int16x8_1Float32x4_1_Medium(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00369,pFStack_20,reader);
    break;
  case 0x163:
    data_x00372 = ByteCodeReader::Int16x8_1Int32x4_1_Medium(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00372,pFStack_20,reader);
    break;
  case 0x164:
    data_x00375 = ByteCodeReader::Int16x8_1Int8x16_1_Medium(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00375,pFStack_20,reader);
    break;
  case 0x165:
    data_x00378 = ByteCodeReader::Int16x8_1Uint32x4_1_Medium(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00378,pFStack_20,reader);
    break;
  case 0x166:
    data_x00381 = ByteCodeReader::Int16x8_1Uint16x8_1_Medium(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00381,pFStack_20,reader);
    break;
  case 0x167:
    data_x00384 = ByteCodeReader::Int16x8_1Uint8x16_1_Medium(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00384,pFStack_20,reader);
    break;
  case 0x168:
    data_x00387 = ByteCodeReader::Int8x16_2_Medium(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00387,pFStack_20,reader);
    break;
  case 0x169:
    data_x00390 = ByteCodeReader::Int8x16_3_Medium(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00390,pFStack_20,reader);
    break;
  case 0x16a:
    data_x00393 = ByteCodeReader::Int8x16_1Int16_Medium(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00393,pFStack_20,reader);
    break;
  case 0x16b:
    data_x00396 = ByteCodeReader::Int8x16_2Int16_Medium(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00396,pFStack_20,reader);
    break;
  case 0x16c:
    data_x00399 = ByteCodeReader::Int8x16_3Int16_Medium(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00399,pFStack_20,reader);
    break;
  case 0x16d:
    data_x00402 = ByteCodeReader::Int8x16_1Int1_Medium(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00402,pFStack_20,reader);
    break;
  case 0x16e:
    data_x00405 = ByteCodeReader::Int8x16_2Int1_Medium(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00405,pFStack_20,reader);
    break;
  case 0x16f:
    data_x00408 = ByteCodeReader::Reg1Int8x16_1_Medium(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00408,pFStack_20,reader);
    break;
  case 0x170:
    data_x00411 = ByteCodeReader::Bool8x16_1Int8x16_2_Medium(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00411,pFStack_20,reader);
    break;
  case 0x171:
    data_x00414 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Medium(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00414,pFStack_20,reader);
    break;
  case 0x172:
    data_x00417 = ByteCodeReader::Int8x16_1Float32x4_1_Medium(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00417,pFStack_20,reader);
    break;
  case 0x173:
    data_x00420 = ByteCodeReader::Int8x16_1Int32x4_1_Medium(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00420,pFStack_20,reader);
    break;
  case 0x174:
    data_x00423 = ByteCodeReader::Int8x16_1Int16x8_1_Medium(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00423,pFStack_20,reader);
    break;
  case 0x175:
    data_x00426 = ByteCodeReader::Int8x16_1Uint32x4_1_Medium(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00426,pFStack_20,reader);
    break;
  case 0x176:
    data_x00429 = ByteCodeReader::Int8x16_1Uint16x8_1_Medium(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00429,pFStack_20,reader);
    break;
  case 0x177:
    data_x00432 = ByteCodeReader::Int8x16_1Uint8x16_1_Medium(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00432,pFStack_20,reader);
    break;
  case 0x178:
    data_x00435 = ByteCodeReader::Int1Int8x16_1Int1_Medium(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00435,pFStack_20,reader);
    break;
  case 0x179:
    data_x00438 = ByteCodeReader::Int8x16_2Int2_Medium(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00438,pFStack_20,reader);
    break;
  case 0x17a:
    data_x00441 = ByteCodeReader::Uint32x4_1Int4_Medium(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00441,pFStack_20,reader);
    break;
  case 0x17b:
    data_x00444 = ByteCodeReader::Reg1Uint32x4_1_Medium(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00444,pFStack_20,reader);
    break;
  case 0x17c:
    data_x00447 = ByteCodeReader::Uint32x4_2_Medium(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00447,pFStack_20,reader);
    break;
  case 0x17d:
    data_x00450 = ByteCodeReader::Int1Uint32x4_1Int1_Medium(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00450,pFStack_20,reader);
    break;
  case 0x17e:
    data_x00453 = ByteCodeReader::Uint32x4_2Int4_Medium(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00453,pFStack_20,reader);
    break;
  case 0x17f:
    data_x00456 = ByteCodeReader::Uint32x4_3Int4_Medium(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00456,pFStack_20,reader);
    break;
  case 0x180:
    data_x00459 = ByteCodeReader::Uint32x4_1Int1_Medium(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00459,pFStack_20,reader);
    break;
  case 0x181:
    data_x00462 = ByteCodeReader::Uint32x4_2Int2_Medium(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00462,pFStack_20,reader);
    break;
  case 0x182:
    data_x00465 = ByteCodeReader::Uint32x4_3_Medium(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00465,pFStack_20,reader);
    break;
  case 0x183:
    data_x00468 = ByteCodeReader::Bool32x4_1Uint32x4_2_Medium(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00468,pFStack_20,reader);
    break;
  case 0x184:
    data_x00471 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Medium(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00471,pFStack_20,reader);
    break;
  case 0x185:
    data_x00474 = ByteCodeReader::Uint32x4_2Int1_Medium(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00474,pFStack_20,reader);
    break;
  case 0x186:
    data_x00477 = ByteCodeReader::Uint32x4_1Float32x4_1_Medium(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00477,pFStack_20,reader);
    break;
  case 0x187:
    data_x00480 = ByteCodeReader::Uint32x4_1Int32x4_1_Medium(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00480,pFStack_20,reader);
    break;
  case 0x188:
    data_x00483 = ByteCodeReader::Uint32x4_1Int16x8_1_Medium(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00483,pFStack_20,reader);
    break;
  case 0x189:
    data_x00486 = ByteCodeReader::Uint32x4_1Int8x16_1_Medium(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00486,pFStack_20,reader);
    break;
  case 0x18a:
    data_x00489 = ByteCodeReader::Uint32x4_1Uint16x8_1_Medium(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00489,pFStack_20,reader);
    break;
  case 0x18b:
    data_x00492 = ByteCodeReader::Uint32x4_1Uint8x16_1_Medium(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00492,pFStack_20,reader);
    break;
  case 0x18c:
    data_x00495 = ByteCodeReader::Uint16x8_1Int8_Medium(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00495,pFStack_20,reader);
    break;
  case 0x18d:
    data_x00498 = ByteCodeReader::Reg1Uint16x8_1_Medium(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00498,pFStack_20,reader);
    break;
  case 0x18e:
    data_x00501 = ByteCodeReader::Uint16x8_2_Medium(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00501,pFStack_20,reader);
    break;
  case 399:
    data_x00504 = ByteCodeReader::Int1Uint16x8_1Int1_Medium(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00504,pFStack_20,reader);
    break;
  case 400:
    data_x00507 = ByteCodeReader::Uint16x8_2Int8_Medium(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00507,pFStack_20,reader);
    break;
  case 0x191:
    data_x00510 = ByteCodeReader::Uint16x8_3Int8_Medium(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00510,pFStack_20,reader);
    break;
  case 0x192:
    data_x00513 = ByteCodeReader::Uint16x8_1Int1_Medium(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00513,pFStack_20,reader);
    break;
  case 0x193:
    data_x00516 = ByteCodeReader::Uint16x8_2Int2_Medium(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00516,pFStack_20,reader);
    break;
  case 0x194:
    data_x00519 = ByteCodeReader::Uint16x8_3_Medium(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00519,pFStack_20,reader);
    break;
  case 0x195:
    data_x00522 = ByteCodeReader::Bool16x8_1Uint16x8_2_Medium(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00522,pFStack_20,reader);
    break;
  case 0x196:
    data_x00525 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Medium(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00525,pFStack_20,reader);
    break;
  case 0x197:
    data_x00528 = ByteCodeReader::Uint16x8_2Int1_Medium(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00528,pFStack_20,reader);
    break;
  case 0x198:
    data_x00531 = ByteCodeReader::Uint16x8_1Float32x4_1_Medium(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00531,pFStack_20,reader);
    break;
  case 0x199:
    data_x00534 = ByteCodeReader::Uint16x8_1Int32x4_1_Medium(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00534,pFStack_20,reader);
    break;
  case 0x19a:
    data_x00537 = ByteCodeReader::Uint16x8_1Int16x8_1_Medium(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00537,pFStack_20,reader);
    break;
  case 0x19b:
    data_x00540 = ByteCodeReader::Uint16x8_1Int8x16_1_Medium(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00540,pFStack_20,reader);
    break;
  case 0x19c:
    data_x00543 = ByteCodeReader::Uint16x8_1Uint32x4_1_Medium(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00543,pFStack_20,reader);
    break;
  case 0x19d:
    data_x00546 = ByteCodeReader::Uint16x8_1Uint8x16_1_Medium(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00546,pFStack_20,reader);
    break;
  case 0x19e:
    data_x00549 = ByteCodeReader::Uint8x16_1Int16_Medium(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00549,pFStack_20,reader);
    break;
  case 0x19f:
    data_x00552 = ByteCodeReader::Reg1Uint8x16_1_Medium(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00552,pFStack_20,reader);
    break;
  case 0x1a0:
    data_x00555 = ByteCodeReader::Uint8x16_2_Medium(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00555,pFStack_20,reader);
    break;
  case 0x1a1:
    data_x00558 = ByteCodeReader::Int1Uint8x16_1Int1_Medium(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00558,pFStack_20,reader);
    break;
  case 0x1a2:
    data_x00561 = ByteCodeReader::Uint8x16_2Int16_Medium(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00561,pFStack_20,reader);
    break;
  case 0x1a3:
    data_x00564 = ByteCodeReader::Uint8x16_3Int16_Medium(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00564,pFStack_20,reader);
    break;
  case 0x1a4:
    data_x00567 = ByteCodeReader::Uint8x16_1Int1_Medium(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00567,pFStack_20,reader);
    break;
  case 0x1a5:
    data_x00570 = ByteCodeReader::Uint8x16_2Int2_Medium(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00570,pFStack_20,reader);
    break;
  case 0x1a6:
    data_x00573 = ByteCodeReader::Uint8x16_3_Medium(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00573,pFStack_20,reader);
    break;
  case 0x1a7:
    data_x00576 = ByteCodeReader::Bool8x16_1Uint8x16_2_Medium(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00576,pFStack_20,reader);
    break;
  case 0x1a8:
    data_x00579 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Medium(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00579,pFStack_20,reader);
    break;
  case 0x1a9:
    data_x00582 = ByteCodeReader::Uint8x16_2Int1_Medium(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00582,pFStack_20,reader);
    break;
  case 0x1aa:
    data_x00585 = ByteCodeReader::Uint8x16_1Float32x4_1_Medium(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00585,pFStack_20,reader);
    break;
  case 0x1ab:
    data_x00588 = ByteCodeReader::Uint8x16_1Int32x4_1_Medium(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00588,pFStack_20,reader);
    break;
  case 0x1ac:
    data_x00591 = ByteCodeReader::Uint8x16_1Int16x8_1_Medium(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00591,pFStack_20,reader);
    break;
  case 0x1ad:
    data_x00594 = ByteCodeReader::Uint8x16_1Int8x16_1_Medium(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00594,pFStack_20,reader);
    break;
  case 0x1ae:
    data_x00597 = ByteCodeReader::Uint8x16_1Uint32x4_1_Medium(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00597,pFStack_20,reader);
    break;
  case 0x1af:
    data_x00600 = ByteCodeReader::Uint8x16_1Uint16x8_1_Medium(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00600,pFStack_20,reader);
    break;
  case 0x1b0:
    data_x00603 = ByteCodeReader::Bool32x4_1Int1_Medium(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00603,pFStack_20,reader);
    break;
  case 0x1b1:
    data_x00606 = ByteCodeReader::Bool32x4_1Int4_Medium(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00606,pFStack_20,reader);
    break;
  case 0x1b2:
    data_x00609 = ByteCodeReader::Int1Bool32x4_1Int1_Medium(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00609,pFStack_20,reader);
    break;
  case 0x1b3:
    data_x00612 = ByteCodeReader::Bool32x4_2Int2_Medium(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00612,pFStack_20,reader);
    break;
  case 0x1b4:
    data_x00615 = ByteCodeReader::Int1Bool32x4_1_Medium(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00615,pFStack_20,reader);
    break;
  case 0x1b5:
    data_x00618 = ByteCodeReader::Bool32x4_2_Medium(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00618,pFStack_20,reader);
    break;
  case 0x1b6:
    data_x00621 = ByteCodeReader::Bool32x4_3_Medium(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00621,pFStack_20,reader);
    break;
  case 0x1b7:
    data_x00624 = ByteCodeReader::Reg1Bool32x4_1_Medium(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00624,pFStack_20,reader);
    break;
  case 0x1b8:
    data_x00627 = ByteCodeReader::Bool16x8_1Int1_Medium(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00627,pFStack_20,reader);
    break;
  case 0x1b9:
    data_x00630 = ByteCodeReader::Bool16x8_1Int8_Medium(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00630,pFStack_20,reader);
    break;
  case 0x1ba:
    data_x00633 = ByteCodeReader::Int1Bool16x8_1Int1_Medium(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00633,pFStack_20,reader);
    break;
  case 0x1bb:
    data_x00636 = ByteCodeReader::Bool16x8_2Int2_Medium(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00636,pFStack_20,reader);
    break;
  case 0x1bc:
    data_x00639 = ByteCodeReader::Int1Bool16x8_1_Medium(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00639,pFStack_20,reader);
    break;
  case 0x1bd:
    data_x00642 = ByteCodeReader::Bool16x8_2_Medium(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00642,pFStack_20,reader);
    break;
  case 0x1be:
    data_x00645 = ByteCodeReader::Bool16x8_3_Medium(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00645,pFStack_20,reader);
    break;
  case 0x1bf:
    data_x00648 = ByteCodeReader::Reg1Bool16x8_1_Medium(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00648,pFStack_20,reader);
    break;
  case 0x1c0:
    data_x00651 = ByteCodeReader::Bool8x16_1Int1_Medium(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00651,pFStack_20,reader);
    break;
  case 0x1c1:
    data_x00654 = ByteCodeReader::Bool8x16_1Int16_Medium(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00654,pFStack_20,reader);
    break;
  case 0x1c2:
    data_x00657 = ByteCodeReader::Int1Bool8x16_1_Medium(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00657,pFStack_20,reader);
    break;
  case 0x1c3:
    data_x00660 = ByteCodeReader::Int1Bool8x16_1Int1_Medium(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00660,pFStack_20,reader);
    break;
  case 0x1c4:
    data_x00663 = ByteCodeReader::Bool8x16_2Int2_Medium(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00663,pFStack_20,reader);
    break;
  case 0x1c5:
    data_x00666 = ByteCodeReader::Bool8x16_2_Medium(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00666,pFStack_20,reader);
    break;
  case 0x1c6:
    data_x00669 = ByteCodeReader::Bool8x16_3_Medium(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00669,pFStack_20,reader);
    break;
  case 0x1c7:
    data_x00672 = ByteCodeReader::Reg1Bool8x16_1_Medium(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00672,pFStack_20,reader);
    break;
  case 0x1c8:
    data_x00675 = ByteCodeReader::AsmSimdTypedArr_Medium(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00675,pFStack_20,reader);
    break;
  case 0x1c9:
    data_x00678 = ByteCodeReader::AsmShuffle_Medium(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
              (op,data_x00678,pFStack_20,reader);
    break;
  case 0x1ca:
    data_01 = ByteCodeReader::ElementSlot_Large(reader);
    DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_01,pFStack_20,reader);
    break;
  case 0x1cd:
    data_06 = ByteCodeReader::AsmTypedArr_Large(reader);
    DumpAsmTypedArr<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_06,pFStack_20,reader);
    break;
  case 0x1ce:
    data_09 = ByteCodeReader::WasmMemAccess_Large(reader);
    DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_09,pFStack_20,reader);
    break;
  case 0x1cf:
    data_12 = ByteCodeReader::AsmCall_Large(reader);
    DumpAsmCall<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_12,pFStack_20,reader);
    break;
  case 0x1d0:
    data_15 = ByteCodeReader::ProfiledAsmCall_Large(reader);
    DumpProfiledAsmCall<Js::OpLayoutDynamicProfile<Js::OpLayoutT_AsmCall<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>__unaligned>
              (op,data_15,pFStack_20,reader);
    break;
  case 0x1d2:
    data_19 = ByteCodeReader::AsmReg1_Large(reader);
    DumpAsmReg1<Js::OpLayoutT_AsmReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_19,pFStack_20,reader);
    break;
  case 0x1d3:
    data_22 = ByteCodeReader::AsmReg2_Large(reader);
    DumpAsmReg2<Js::OpLayoutT_AsmReg2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_22,pFStack_20,reader);
    break;
  case 0x1d4:
    data_25 = ByteCodeReader::AsmReg3_Large(reader);
    DumpAsmReg3<Js::OpLayoutT_AsmReg3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_25,pFStack_20,reader);
    break;
  case 0x1d5:
    data_28 = ByteCodeReader::AsmReg4_Large(reader);
    DumpAsmReg4<Js::OpLayoutT_AsmReg4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_28,pFStack_20,reader);
    break;
  case 0x1d6:
    data_31 = ByteCodeReader::AsmReg5_Large(reader);
    DumpAsmReg5<Js::OpLayoutT_AsmReg5<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_31,pFStack_20,reader);
    break;
  case 0x1d7:
    data_34 = ByteCodeReader::AsmReg6_Large(reader);
    DumpAsmReg6<Js::OpLayoutT_AsmReg6<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_34,pFStack_20,reader);
    break;
  case 0x1d8:
    data_37 = ByteCodeReader::AsmReg7_Large(reader);
    DumpAsmReg7<Js::OpLayoutT_AsmReg7<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_37,pFStack_20,reader);
    break;
  case 0x1d9:
    data_40 = ByteCodeReader::AsmReg9_Large(reader);
    DumpAsmReg9<Js::OpLayoutT_AsmReg9<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_40,pFStack_20,reader);
    break;
  case 0x1da:
    data_43 = ByteCodeReader::AsmReg10_Large(reader);
    DumpAsmReg10<Js::OpLayoutT_AsmReg10<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_43,pFStack_20,reader);
    break;
  case 0x1db:
    data_46 = ByteCodeReader::AsmReg11_Large(reader);
    DumpAsmReg11<Js::OpLayoutT_AsmReg11<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_46,pFStack_20,reader);
    break;
  case 0x1dc:
    data_49 = ByteCodeReader::AsmReg17_Large(reader);
    DumpAsmReg17<Js::OpLayoutT_AsmReg17<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_49,pFStack_20,reader);
    break;
  case 0x1dd:
    data_52 = ByteCodeReader::AsmReg18_Large(reader);
    DumpAsmReg18<Js::OpLayoutT_AsmReg18<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_52,pFStack_20,reader);
    break;
  case 0x1de:
    data_55 = ByteCodeReader::AsmReg19_Large(reader);
    DumpAsmReg19<Js::OpLayoutT_AsmReg19<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_55,pFStack_20,reader);
    break;
  case 0x1df:
    data_58 = ByteCodeReader::Int1Double1_Large(reader);
    DumpInt1Double1<Js::OpLayoutT_Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_58,pFStack_20,reader);
    break;
  case 0x1e0:
    data_61 = ByteCodeReader::Int1Float1_Large(reader);
    DumpInt1Float1<Js::OpLayoutT_Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_61,pFStack_20,reader);
    break;
  case 0x1e1:
    data_64 = ByteCodeReader::Double1Const1_Large(reader);
    DumpDouble1Const1<Js::OpLayoutT_Double1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_64,pFStack_20,reader);
    break;
  case 0x1e2:
    data_67 = ByteCodeReader::Double1Int1_Large(reader);
    DumpDouble1Int1<Js::OpLayoutT_Double1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_67,pFStack_20,reader);
    break;
  case 0x1e3:
    data_70 = ByteCodeReader::Double1Float1_Large(reader);
    DumpDouble1Float1<Js::OpLayoutT_Double1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_70,pFStack_20,reader);
    break;
  case 0x1e4:
    data_73 = ByteCodeReader::Double1Reg1_Large(reader);
    DumpDouble1Reg1<Js::OpLayoutT_Double1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_73,pFStack_20,reader);
    break;
  case 0x1e5:
    data_76 = ByteCodeReader::Float1Reg1_Large(reader);
    DumpFloat1Reg1<Js::OpLayoutT_Float1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_76,pFStack_20,reader);
    break;
  case 0x1e6:
    data_79 = ByteCodeReader::Int1Reg1_Large(reader);
    DumpInt1Reg1<Js::OpLayoutT_Int1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_79,pFStack_20,reader);
    break;
  case 0x1e7:
    data_82 = ByteCodeReader::Reg1Double1_Large(reader);
    DumpReg1Double1<Js::OpLayoutT_Reg1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_82,pFStack_20,reader);
    break;
  case 0x1e8:
    data_85 = ByteCodeReader::Reg1Float1_Large(reader);
    DumpReg1Float1<Js::OpLayoutT_Reg1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_85,pFStack_20,reader);
    break;
  case 0x1e9:
    data_88 = ByteCodeReader::Reg1Int1_Large(reader);
    DumpReg1Int1<Js::OpLayoutT_Reg1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_88,pFStack_20,reader);
    break;
  case 0x1ea:
    data_91 = ByteCodeReader::Int1Const1_Large(reader);
    DumpInt1Const1<Js::OpLayoutT_Int1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_91,pFStack_20,reader);
    break;
  case 0x1eb:
    data_94 = ByteCodeReader::Reg1IntConst1_Large(reader);
    DumpReg1IntConst1<Js::OpLayoutT_Reg1IntConst1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_94,pFStack_20,reader);
    break;
  case 0x1ec:
    data_97 = ByteCodeReader::Int1Double2_Large(reader);
    DumpInt1Double2<Js::OpLayoutT_Int1Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_97,pFStack_20,reader);
    break;
  case 0x1ed:
    data_x00100 = ByteCodeReader::Int1Float2_Large(reader);
    DumpInt1Float2<Js::OpLayoutT_Int1Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00100,pFStack_20,reader);
    break;
  case 0x1ee:
    data_x00103 = ByteCodeReader::Int2_Large(reader);
    DumpInt2<Js::OpLayoutT_Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00103,pFStack_20,reader);
    break;
  case 0x1ef:
    data_x00106 = ByteCodeReader::Int3_Large(reader);
    DumpInt3<Js::OpLayoutT_Int3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00106,pFStack_20,reader);
    break;
  case 0x1f0:
    data_x00109 = ByteCodeReader::Double2_Large(reader);
    DumpDouble2<Js::OpLayoutT_Double2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00109,pFStack_20,reader);
    break;
  case 0x1f1:
    data_x00112 = ByteCodeReader::Float2_Large(reader);
    DumpFloat2<Js::OpLayoutT_Float2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00112,pFStack_20,reader);
    break;
  case 0x1f2:
    data_x00115 = ByteCodeReader::Float3_Large(reader);
    DumpFloat3<Js::OpLayoutT_Float3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00115,pFStack_20,reader);
    break;
  case 499:
    data_x00118 = ByteCodeReader::Float1Const1_Large(reader);
    DumpFloat1Const1<Js::OpLayoutT_Float1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00118,pFStack_20,reader);
    break;
  case 500:
    data_x00121 = ByteCodeReader::Float1Double1_Large(reader);
    DumpFloat1Double1<Js::OpLayoutT_Float1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00121,pFStack_20,reader);
    break;
  case 0x1f5:
    data_x00124 = ByteCodeReader::Float1Int1_Large(reader);
    DumpFloat1Int1<Js::OpLayoutT_Float1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00124,pFStack_20,reader);
    break;
  case 0x1f6:
    data_x00127 = ByteCodeReader::Double3_Large(reader);
    DumpDouble3<Js::OpLayoutT_Double3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00127,pFStack_20,reader);
    break;
  case 0x1f7:
    data_x00130 = ByteCodeReader::BrInt1_Large(reader);
    DumpBrInt1<Js::OpLayoutT_BrInt1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00130,pFStack_20,reader);
    break;
  case 0x1f8:
    data_x00133 = ByteCodeReader::BrInt2_Large(reader);
    DumpBrInt2<Js::OpLayoutT_BrInt2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00133,pFStack_20,reader);
    break;
  case 0x1f9:
    data_x00136 = ByteCodeReader::BrInt1Const1_Large(reader);
    DumpBrInt1Const1<Js::OpLayoutT_BrInt1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00136,pFStack_20,reader);
    break;
  case 0x1fa:
    data_x00139 = ByteCodeReader::AsmUnsigned1_Large(reader);
    DumpAsmUnsigned1<Js::OpLayoutT_AsmUnsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00139,pFStack_20,reader);
    break;
  case 0x1fb:
    data_x00142 = ByteCodeReader::WasmLoopStart_Large(reader);
    DumpWasmLoopStart<Js::OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00142,pFStack_20,reader);
    break;
  case 0x1fc:
    data_x00145 = ByteCodeReader::Long1Reg1_Large(reader);
    DumpLong1Reg1<Js::OpLayoutT_Long1Reg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00145,pFStack_20,reader);
    break;
  case 0x1fd:
    data_x00148 = ByteCodeReader::Reg1Long1_Large(reader);
    DumpReg1Long1<Js::OpLayoutT_Reg1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00148,pFStack_20,reader);
    break;
  case 0x1fe:
    data_x00151 = ByteCodeReader::Long1Const1_Large(reader);
    DumpLong1Const1<Js::OpLayoutT_Long1Const1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00151,pFStack_20,reader);
    break;
  case 0x1ff:
    data_x00154 = ByteCodeReader::Long2_Large(reader);
    DumpLong2<Js::OpLayoutT_Long2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00154,pFStack_20,reader);
    break;
  case 0x200:
    data_x00157 = ByteCodeReader::Long3_Large(reader);
    DumpLong3<Js::OpLayoutT_Long3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00157,pFStack_20,reader);
    break;
  case 0x201:
    data_x00160 = ByteCodeReader::Int1Long2_Large(reader);
    DumpInt1Long2<Js::OpLayoutT_Int1Long2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00160,pFStack_20,reader);
    break;
  case 0x202:
    data_x00163 = ByteCodeReader::Long1Int1_Large(reader);
    DumpLong1Int1<Js::OpLayoutT_Long1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00163,pFStack_20,reader);
    break;
  case 0x203:
    data_x00166 = ByteCodeReader::Int1Long1_Large(reader);
    DumpInt1Long1<Js::OpLayoutT_Int1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00166,pFStack_20,reader);
    break;
  case 0x204:
    data_x00169 = ByteCodeReader::Long1Float1_Large(reader);
    DumpLong1Float1<Js::OpLayoutT_Long1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00169,pFStack_20,reader);
    break;
  case 0x205:
    data_x00172 = ByteCodeReader::Float1Long1_Large(reader);
    DumpFloat1Long1<Js::OpLayoutT_Float1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00172,pFStack_20,reader);
    break;
  case 0x206:
    data_x00175 = ByteCodeReader::Long1Double1_Large(reader);
    DumpLong1Double1<Js::OpLayoutT_Long1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00175,pFStack_20,reader);
    break;
  case 0x207:
    data_x00178 = ByteCodeReader::Double1Long1_Large(reader);
    DumpDouble1Long1<Js::OpLayoutT_Double1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00178,pFStack_20,reader);
    break;
  case 0x208:
    data_x00181 = ByteCodeReader::Float32x4_2_Large(reader);
    DumpFloat32x4_2<Js::OpLayoutT_Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00181,pFStack_20,reader);
    break;
  case 0x209:
    data_x00184 = ByteCodeReader::Float32x4_3_Large(reader);
    DumpFloat32x4_3<Js::OpLayoutT_Float32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00184,pFStack_20,reader);
    break;
  case 0x20a:
    data_x00187 = ByteCodeReader::Float32x4_4_Large(reader);
    DumpFloat32x4_4<Js::OpLayoutT_Float32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00187,pFStack_20,reader);
    break;
  case 0x20b:
    data_x00190 = ByteCodeReader::Bool32x4_1Float32x4_2_Large(reader);
    DumpBool32x4_1Float32x4_2<Js::OpLayoutT_Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00190,pFStack_20,reader);
    break;
  case 0x20c:
    data_x00193 = ByteCodeReader::Float32x4_1Bool32x4_1Float32x4_2_Large(reader);
    DumpFloat32x4_1Bool32x4_1Float32x4_2<Js::OpLayoutT_Float32x4_1Bool32x4_1Float32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00193,pFStack_20,reader);
    break;
  case 0x20d:
    data_x00196 = ByteCodeReader::Float32x4_1Float4_Large(reader);
    DumpFloat32x4_1Float4<Js::OpLayoutT_Float32x4_1Float4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00196,pFStack_20,reader);
    break;
  case 0x20e:
    data_x00199 = ByteCodeReader::Float32x4_2Int4_Large(reader);
    DumpFloat32x4_2Int4<Js::OpLayoutT_Float32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00199,pFStack_20,reader);
    break;
  case 0x20f:
    data_x00202 = ByteCodeReader::Float32x4_3Int4_Large(reader);
    DumpFloat32x4_3Int4<Js::OpLayoutT_Float32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00202,pFStack_20,reader);
    break;
  case 0x210:
    data_x00205 = ByteCodeReader::Float32x4_1Float1_Large(reader);
    DumpFloat32x4_1Float1<Js::OpLayoutT_Float32x4_1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00205,pFStack_20,reader);
    break;
  case 0x211:
    data_x00208 = ByteCodeReader::Float32x4_2Float1_Large(reader);
    DumpFloat32x4_2Float1<Js::OpLayoutT_Float32x4_2Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00208,pFStack_20,reader);
    break;
  case 0x212:
    data_x00211 = ByteCodeReader::Float32x4_1Int32x4_1_Large(reader);
    DumpFloat32x4_1Int32x4_1<Js::OpLayoutT_Float32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00211,pFStack_20,reader);
    break;
  case 0x213:
    data_x00214 = ByteCodeReader::Float32x4_1Uint32x4_1_Large(reader);
    DumpFloat32x4_1Uint32x4_1<Js::OpLayoutT_Float32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00214,pFStack_20,reader);
    break;
  case 0x214:
    data_x00217 = ByteCodeReader::Float32x4_1Int16x8_1_Large(reader);
    DumpFloat32x4_1Int16x8_1<Js::OpLayoutT_Float32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00217,pFStack_20,reader);
    break;
  case 0x215:
    data_x00220 = ByteCodeReader::Float32x4_1Uint16x8_1_Large(reader);
    DumpFloat32x4_1Uint16x8_1<Js::OpLayoutT_Float32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00220,pFStack_20,reader);
    break;
  case 0x216:
    data_x00223 = ByteCodeReader::Float32x4_1Int8x16_1_Large(reader);
    DumpFloat32x4_1Int8x16_1<Js::OpLayoutT_Float32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00223,pFStack_20,reader);
    break;
  case 0x217:
    data_x00226 = ByteCodeReader::Float32x4_1Uint8x16_1_Large(reader);
    DumpFloat32x4_1Uint8x16_1<Js::OpLayoutT_Float32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00226,pFStack_20,reader);
    break;
  case 0x218:
    data_x00229 = ByteCodeReader::Reg1Float32x4_1_Large(reader);
    DumpReg1Float32x4_1<Js::OpLayoutT_Reg1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00229,pFStack_20,reader);
    break;
  case 0x219:
    data_x00232 = ByteCodeReader::Float1Float32x4_1Int1_Large(reader);
    DumpFloat1Float32x4_1Int1<Js::OpLayoutT_Float1Float32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00232,pFStack_20,reader);
    break;
  case 0x21a:
    data_x00235 = ByteCodeReader::Float32x4_2Int1Float1_Large(reader);
    DumpFloat32x4_2Int1Float1<Js::OpLayoutT_Float32x4_2Int1Float1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00235,pFStack_20,reader);
    break;
  case 0x21b:
    data_x00238 = ByteCodeReader::Int32x4_2_Large(reader);
    DumpInt32x4_2<Js::OpLayoutT_Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00238,pFStack_20,reader);
    break;
  case 0x21c:
    data_x00241 = ByteCodeReader::Int32x4_3_Large(reader);
    DumpInt32x4_3<Js::OpLayoutT_Int32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00241,pFStack_20,reader);
    break;
  case 0x21d:
    data_x00244 = ByteCodeReader::Int32x4_4_Large(reader);
    DumpInt32x4_4<Js::OpLayoutT_Int32x4_4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00244,pFStack_20,reader);
    break;
  case 0x21e:
    data_x00247 = ByteCodeReader::Bool32x4_1Int32x4_2_Large(reader);
    DumpBool32x4_1Int32x4_2<Js::OpLayoutT_Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00247,pFStack_20,reader);
    break;
  case 0x21f:
    data_x00250 = ByteCodeReader::Int32x4_1Bool32x4_1Int32x4_2_Large(reader);
    DumpInt32x4_1Bool32x4_1Int32x4_2<Js::OpLayoutT_Int32x4_1Bool32x4_1Int32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00250,pFStack_20,reader);
    break;
  case 0x220:
    data_x00253 = ByteCodeReader::Int32x4_1Int4_Large(reader);
    DumpInt32x4_1Int4<Js::OpLayoutT_Int32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00253,pFStack_20,reader);
    break;
  case 0x221:
    data_x00256 = ByteCodeReader::Int32x4_2Int4_Large(reader);
    DumpInt32x4_2Int4<Js::OpLayoutT_Int32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00256,pFStack_20,reader);
    break;
  case 0x222:
    data_x00259 = ByteCodeReader::Int32x4_3Int4_Large(reader);
    DumpInt32x4_3Int4<Js::OpLayoutT_Int32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00259,pFStack_20,reader);
    break;
  case 0x223:
    data_x00262 = ByteCodeReader::Int32x4_1Int1_Large(reader);
    DumpInt32x4_1Int1<Js::OpLayoutT_Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00262,pFStack_20,reader);
    break;
  case 0x224:
    data_x00265 = ByteCodeReader::Int32x4_2Int1_Large(reader);
    DumpInt32x4_2Int1<Js::OpLayoutT_Int32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00265,pFStack_20,reader);
    break;
  case 0x225:
    data_x00268 = ByteCodeReader::Reg1Int32x4_1_Large(reader);
    DumpReg1Int32x4_1<Js::OpLayoutT_Reg1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00268,pFStack_20,reader);
    break;
  case 0x226:
    data_x00271 = ByteCodeReader::Int32x4_1Float32x4_1_Large(reader);
    DumpInt32x4_1Float32x4_1<Js::OpLayoutT_Int32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00271,pFStack_20,reader);
    break;
  case 0x227:
    data_x00274 = ByteCodeReader::Int32x4_1Uint32x4_1_Large(reader);
    DumpInt32x4_1Uint32x4_1<Js::OpLayoutT_Int32x4_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00274,pFStack_20,reader);
    break;
  case 0x228:
    data_x00277 = ByteCodeReader::Int32x4_1Int16x8_1_Large(reader);
    DumpInt32x4_1Int16x8_1<Js::OpLayoutT_Int32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00277,pFStack_20,reader);
    break;
  case 0x229:
    data_x00280 = ByteCodeReader::Int32x4_1Uint16x8_1_Large(reader);
    DumpInt32x4_1Uint16x8_1<Js::OpLayoutT_Int32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00280,pFStack_20,reader);
    break;
  case 0x22a:
    data_x00283 = ByteCodeReader::Int32x4_1Int8x16_1_Large(reader);
    DumpInt32x4_1Int8x16_1<Js::OpLayoutT_Int32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00283,pFStack_20,reader);
    break;
  case 0x22b:
    data_x00286 = ByteCodeReader::Int32x4_1Uint8x16_1_Large(reader);
    DumpInt32x4_1Uint8x16_1<Js::OpLayoutT_Int32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00286,pFStack_20,reader);
    break;
  case 0x22c:
    data_x00289 = ByteCodeReader::Int1Int32x4_1Int1_Large(reader);
    DumpInt1Int32x4_1Int1<Js::OpLayoutT_Int1Int32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00289,pFStack_20,reader);
    break;
  case 0x22d:
    data_x00292 = ByteCodeReader::Int32x4_2Int2_Large(reader);
    DumpInt32x4_2Int2<Js::OpLayoutT_Int32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00292,pFStack_20,reader);
    break;
  case 0x22e:
    data_x00295 = ByteCodeReader::Float32x4_IntConst4_Large(reader);
    DumpFloat32x4_IntConst4<Js::OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00295,pFStack_20,reader);
    break;
  case 0x22f:
    data_x00298 = ByteCodeReader::Double1Float64x2_1Int1_Large(reader);
    DumpDouble1Float64x2_1Int1<Js::OpLayoutT_Double1Float64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00298,pFStack_20,reader);
    break;
  case 0x230:
    data_x00301 = ByteCodeReader::Float64x2_2Int1Double1_Large(reader);
    DumpFloat64x2_2Int1Double1<Js::OpLayoutT_Float64x2_2Int1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00301,pFStack_20,reader);
    break;
  case 0x231:
    data_x00304 = ByteCodeReader::Float64x2_2_Large(reader);
    DumpFloat64x2_2<Js::OpLayoutT_Float64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00304,pFStack_20,reader);
    break;
  case 0x232:
    data_x00307 = ByteCodeReader::Float64x2_3_Large(reader);
    DumpFloat64x2_3<Js::OpLayoutT_Float64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00307,pFStack_20,reader);
    break;
  case 0x233:
    data_x00310 = ByteCodeReader::Float64x2_1Double1_Large(reader);
    DumpFloat64x2_1Double1<Js::OpLayoutT_Float64x2_1Double1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00310,pFStack_20,reader);
    break;
  case 0x234:
    data_x00313 = ByteCodeReader::Int64x2_1Long1_Large(reader);
    DumpInt64x2_1Long1<Js::OpLayoutT_Int64x2_1Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00313,pFStack_20,reader);
    break;
  case 0x235:
    data_x00316 = ByteCodeReader::Long1Int64x2_1Int1_Large(reader);
    DumpLong1Int64x2_1Int1<Js::OpLayoutT_Long1Int64x2_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00316,pFStack_20,reader);
    break;
  case 0x236:
    data_x00319 = ByteCodeReader::Int64x2_2_Int1_Long1_Large(reader);
    DumpInt64x2_2_Int1_Long1<Js::OpLayoutT_Int64x2_2_Int1_Long1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00319,pFStack_20,reader);
    break;
  case 0x237:
    data_x00322 = ByteCodeReader::Int64x2_3_Large(reader);
    DumpInt64x2_3<Js::OpLayoutT_Int64x2_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00322,pFStack_20,reader);
    break;
  case 0x238:
    data_x00325 = ByteCodeReader::Int64x2_2_Large(reader);
    DumpInt64x2_2<Js::OpLayoutT_Int64x2_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00325,pFStack_20,reader);
    break;
  case 0x239:
    data_x00328 = ByteCodeReader::Int64x2_2Int1_Large(reader);
    DumpInt64x2_2Int1<Js::OpLayoutT_Int64x2_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00328,pFStack_20,reader);
    break;
  case 0x23a:
    data_x00331 = ByteCodeReader::Int1Bool64x2_1_Large(reader);
    DumpInt1Bool64x2_1<Js::OpLayoutT_Int1Bool64x2_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00331,pFStack_20,reader);
    break;
  case 0x23b:
    data_x00334 = ByteCodeReader::Int16x8_1Int8_Large(reader);
    DumpInt16x8_1Int8<Js::OpLayoutT_Int16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00334,pFStack_20,reader);
    break;
  case 0x23c:
    data_x00337 = ByteCodeReader::Reg1Int16x8_1_Large(reader);
    DumpReg1Int16x8_1<Js::OpLayoutT_Reg1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00337,pFStack_20,reader);
    break;
  case 0x23d:
    data_x00340 = ByteCodeReader::Int16x8_2_Large(reader);
    DumpInt16x8_2<Js::OpLayoutT_Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00340,pFStack_20,reader);
    break;
  case 0x23e:
    data_x00343 = ByteCodeReader::Int1Int16x8_1Int1_Large(reader);
    DumpInt1Int16x8_1Int1<Js::OpLayoutT_Int1Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00343,pFStack_20,reader);
    break;
  case 0x23f:
    data_x00346 = ByteCodeReader::Int16x8_2Int8_Large(reader);
    DumpInt16x8_2Int8<Js::OpLayoutT_Int16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00346,pFStack_20,reader);
    break;
  case 0x240:
    data_x00349 = ByteCodeReader::Int16x8_3Int8_Large(reader);
    DumpInt16x8_3Int8<Js::OpLayoutT_Int16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00349,pFStack_20,reader);
    break;
  case 0x241:
    data_x00352 = ByteCodeReader::Int16x8_1Int1_Large(reader);
    DumpInt16x8_1Int1<Js::OpLayoutT_Int16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00352,pFStack_20,reader);
    break;
  case 0x242:
    data_x00355 = ByteCodeReader::Int16x8_2Int2_Large(reader);
    DumpInt16x8_2Int2<Js::OpLayoutT_Int16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00355,pFStack_20,reader);
    break;
  case 0x243:
    data_x00358 = ByteCodeReader::Int16x8_3_Large(reader);
    DumpInt16x8_3<Js::OpLayoutT_Int16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00358,pFStack_20,reader);
    break;
  case 0x244:
    data_x00361 = ByteCodeReader::Bool16x8_1Int16x8_2_Large(reader);
    DumpBool16x8_1Int16x8_2<Js::OpLayoutT_Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00361,pFStack_20,reader);
    break;
  case 0x245:
    data_x00364 = ByteCodeReader::Int16x8_1Bool16x8_1Int16x8_2_Large(reader);
    DumpInt16x8_1Bool16x8_1Int16x8_2<Js::OpLayoutT_Int16x8_1Bool16x8_1Int16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00364,pFStack_20,reader);
    break;
  case 0x246:
    data_x00367 = ByteCodeReader::Int16x8_2Int1_Large(reader);
    DumpInt16x8_2Int1<Js::OpLayoutT_Int16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00367,pFStack_20,reader);
    break;
  case 0x247:
    data_x00370 = ByteCodeReader::Int16x8_1Float32x4_1_Large(reader);
    DumpInt16x8_1Float32x4_1<Js::OpLayoutT_Int16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00370,pFStack_20,reader);
    break;
  case 0x248:
    data_x00373 = ByteCodeReader::Int16x8_1Int32x4_1_Large(reader);
    DumpInt16x8_1Int32x4_1<Js::OpLayoutT_Int16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00373,pFStack_20,reader);
    break;
  case 0x249:
    data_x00376 = ByteCodeReader::Int16x8_1Int8x16_1_Large(reader);
    DumpInt16x8_1Int8x16_1<Js::OpLayoutT_Int16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00376,pFStack_20,reader);
    break;
  case 0x24a:
    data_x00379 = ByteCodeReader::Int16x8_1Uint32x4_1_Large(reader);
    DumpInt16x8_1Uint32x4_1<Js::OpLayoutT_Int16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00379,pFStack_20,reader);
    break;
  case 0x24b:
    data_x00382 = ByteCodeReader::Int16x8_1Uint16x8_1_Large(reader);
    DumpInt16x8_1Uint16x8_1<Js::OpLayoutT_Int16x8_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00382,pFStack_20,reader);
    break;
  case 0x24c:
    data_x00385 = ByteCodeReader::Int16x8_1Uint8x16_1_Large(reader);
    DumpInt16x8_1Uint8x16_1<Js::OpLayoutT_Int16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00385,pFStack_20,reader);
    break;
  case 0x24d:
    data_x00388 = ByteCodeReader::Int8x16_2_Large(reader);
    DumpInt8x16_2<Js::OpLayoutT_Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00388,pFStack_20,reader);
    break;
  case 0x24e:
    data_x00391 = ByteCodeReader::Int8x16_3_Large(reader);
    DumpInt8x16_3<Js::OpLayoutT_Int8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00391,pFStack_20,reader);
    break;
  case 0x24f:
    data_x00394 = ByteCodeReader::Int8x16_1Int16_Large(reader);
    DumpInt8x16_1Int16<Js::OpLayoutT_Int8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00394,pFStack_20,reader);
    break;
  case 0x250:
    data_x00397 = ByteCodeReader::Int8x16_2Int16_Large(reader);
    DumpInt8x16_2Int16<Js::OpLayoutT_Int8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00397,pFStack_20,reader);
    break;
  case 0x251:
    data_x00400 = ByteCodeReader::Int8x16_3Int16_Large(reader);
    DumpInt8x16_3Int16<Js::OpLayoutT_Int8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00400,pFStack_20,reader);
    break;
  case 0x252:
    data_x00403 = ByteCodeReader::Int8x16_1Int1_Large(reader);
    DumpInt8x16_1Int1<Js::OpLayoutT_Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00403,pFStack_20,reader);
    break;
  case 0x253:
    data_x00406 = ByteCodeReader::Int8x16_2Int1_Large(reader);
    DumpInt8x16_2Int1<Js::OpLayoutT_Int8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00406,pFStack_20,reader);
    break;
  case 0x254:
    data_x00409 = ByteCodeReader::Reg1Int8x16_1_Large(reader);
    DumpReg1Int8x16_1<Js::OpLayoutT_Reg1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00409,pFStack_20,reader);
    break;
  case 0x255:
    data_x00412 = ByteCodeReader::Bool8x16_1Int8x16_2_Large(reader);
    DumpBool8x16_1Int8x16_2<Js::OpLayoutT_Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00412,pFStack_20,reader);
    break;
  case 0x256:
    data_x00415 = ByteCodeReader::Int8x16_1Bool8x16_1Int8x16_2_Large(reader);
    DumpInt8x16_1Bool8x16_1Int8x16_2<Js::OpLayoutT_Int8x16_1Bool8x16_1Int8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00415,pFStack_20,reader);
    break;
  case 599:
    data_x00418 = ByteCodeReader::Int8x16_1Float32x4_1_Large(reader);
    DumpInt8x16_1Float32x4_1<Js::OpLayoutT_Int8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00418,pFStack_20,reader);
    break;
  case 600:
    data_x00421 = ByteCodeReader::Int8x16_1Int32x4_1_Large(reader);
    DumpInt8x16_1Int32x4_1<Js::OpLayoutT_Int8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00421,pFStack_20,reader);
    break;
  case 0x259:
    data_x00424 = ByteCodeReader::Int8x16_1Int16x8_1_Large(reader);
    DumpInt8x16_1Int16x8_1<Js::OpLayoutT_Int8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00424,pFStack_20,reader);
    break;
  case 0x25a:
    data_x00427 = ByteCodeReader::Int8x16_1Uint32x4_1_Large(reader);
    DumpInt8x16_1Uint32x4_1<Js::OpLayoutT_Int8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00427,pFStack_20,reader);
    break;
  case 0x25b:
    data_x00430 = ByteCodeReader::Int8x16_1Uint16x8_1_Large(reader);
    DumpInt8x16_1Uint16x8_1<Js::OpLayoutT_Int8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00430,pFStack_20,reader);
    break;
  case 0x25c:
    data_x00433 = ByteCodeReader::Int8x16_1Uint8x16_1_Large(reader);
    DumpInt8x16_1Uint8x16_1<Js::OpLayoutT_Int8x16_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00433,pFStack_20,reader);
    break;
  case 0x25d:
    data_x00436 = ByteCodeReader::Int1Int8x16_1Int1_Large(reader);
    DumpInt1Int8x16_1Int1<Js::OpLayoutT_Int1Int8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00436,pFStack_20,reader);
    break;
  case 0x25e:
    data_x00439 = ByteCodeReader::Int8x16_2Int2_Large(reader);
    DumpInt8x16_2Int2<Js::OpLayoutT_Int8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00439,pFStack_20,reader);
    break;
  case 0x25f:
    data_x00442 = ByteCodeReader::Uint32x4_1Int4_Large(reader);
    DumpUint32x4_1Int4<Js::OpLayoutT_Uint32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00442,pFStack_20,reader);
    break;
  case 0x260:
    data_x00445 = ByteCodeReader::Reg1Uint32x4_1_Large(reader);
    DumpReg1Uint32x4_1<Js::OpLayoutT_Reg1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00445,pFStack_20,reader);
    break;
  case 0x261:
    data_x00448 = ByteCodeReader::Uint32x4_2_Large(reader);
    DumpUint32x4_2<Js::OpLayoutT_Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00448,pFStack_20,reader);
    break;
  case 0x262:
    data_x00451 = ByteCodeReader::Int1Uint32x4_1Int1_Large(reader);
    DumpInt1Uint32x4_1Int1<Js::OpLayoutT_Int1Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00451,pFStack_20,reader);
    break;
  case 0x263:
    data_x00454 = ByteCodeReader::Uint32x4_2Int4_Large(reader);
    DumpUint32x4_2Int4<Js::OpLayoutT_Uint32x4_2Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00454,pFStack_20,reader);
    break;
  case 0x264:
    data_x00457 = ByteCodeReader::Uint32x4_3Int4_Large(reader);
    DumpUint32x4_3Int4<Js::OpLayoutT_Uint32x4_3Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00457,pFStack_20,reader);
    break;
  case 0x265:
    data_x00460 = ByteCodeReader::Uint32x4_1Int1_Large(reader);
    DumpUint32x4_1Int1<Js::OpLayoutT_Uint32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00460,pFStack_20,reader);
    break;
  case 0x266:
    data_x00463 = ByteCodeReader::Uint32x4_2Int2_Large(reader);
    DumpUint32x4_2Int2<Js::OpLayoutT_Uint32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00463,pFStack_20,reader);
    break;
  case 0x267:
    data_x00466 = ByteCodeReader::Uint32x4_3_Large(reader);
    DumpUint32x4_3<Js::OpLayoutT_Uint32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00466,pFStack_20,reader);
    break;
  case 0x268:
    data_x00469 = ByteCodeReader::Bool32x4_1Uint32x4_2_Large(reader);
    DumpBool32x4_1Uint32x4_2<Js::OpLayoutT_Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00469,pFStack_20,reader);
    break;
  case 0x269:
    data_x00472 = ByteCodeReader::Uint32x4_1Bool32x4_1Uint32x4_2_Large(reader);
    DumpUint32x4_1Bool32x4_1Uint32x4_2<Js::OpLayoutT_Uint32x4_1Bool32x4_1Uint32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00472,pFStack_20,reader);
    break;
  case 0x26a:
    data_x00475 = ByteCodeReader::Uint32x4_2Int1_Large(reader);
    DumpUint32x4_2Int1<Js::OpLayoutT_Uint32x4_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00475,pFStack_20,reader);
    break;
  case 0x26b:
    data_x00478 = ByteCodeReader::Uint32x4_1Float32x4_1_Large(reader);
    DumpUint32x4_1Float32x4_1<Js::OpLayoutT_Uint32x4_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00478,pFStack_20,reader);
    break;
  case 0x26c:
    data_x00481 = ByteCodeReader::Uint32x4_1Int32x4_1_Large(reader);
    DumpUint32x4_1Int32x4_1<Js::OpLayoutT_Uint32x4_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00481,pFStack_20,reader);
    break;
  case 0x26d:
    data_x00484 = ByteCodeReader::Uint32x4_1Int16x8_1_Large(reader);
    DumpUint32x4_1Int16x8_1<Js::OpLayoutT_Uint32x4_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00484,pFStack_20,reader);
    break;
  case 0x26e:
    data_x00487 = ByteCodeReader::Uint32x4_1Int8x16_1_Large(reader);
    DumpUint32x4_1Int8x16_1<Js::OpLayoutT_Uint32x4_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00487,pFStack_20,reader);
    break;
  case 0x26f:
    data_x00490 = ByteCodeReader::Uint32x4_1Uint16x8_1_Large(reader);
    DumpUint32x4_1Uint16x8_1<Js::OpLayoutT_Uint32x4_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00490,pFStack_20,reader);
    break;
  case 0x270:
    data_x00493 = ByteCodeReader::Uint32x4_1Uint8x16_1_Large(reader);
    DumpUint32x4_1Uint8x16_1<Js::OpLayoutT_Uint32x4_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00493,pFStack_20,reader);
    break;
  case 0x271:
    data_x00496 = ByteCodeReader::Uint16x8_1Int8_Large(reader);
    DumpUint16x8_1Int8<Js::OpLayoutT_Uint16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00496,pFStack_20,reader);
    break;
  case 0x272:
    data_x00499 = ByteCodeReader::Reg1Uint16x8_1_Large(reader);
    DumpReg1Uint16x8_1<Js::OpLayoutT_Reg1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00499,pFStack_20,reader);
    break;
  case 0x273:
    data_x00502 = ByteCodeReader::Uint16x8_2_Large(reader);
    DumpUint16x8_2<Js::OpLayoutT_Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00502,pFStack_20,reader);
    break;
  case 0x274:
    data_x00505 = ByteCodeReader::Int1Uint16x8_1Int1_Large(reader);
    DumpInt1Uint16x8_1Int1<Js::OpLayoutT_Int1Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00505,pFStack_20,reader);
    break;
  case 0x275:
    data_x00508 = ByteCodeReader::Uint16x8_2Int8_Large(reader);
    DumpUint16x8_2Int8<Js::OpLayoutT_Uint16x8_2Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00508,pFStack_20,reader);
    break;
  case 0x276:
    data_x00511 = ByteCodeReader::Uint16x8_3Int8_Large(reader);
    DumpUint16x8_3Int8<Js::OpLayoutT_Uint16x8_3Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00511,pFStack_20,reader);
    break;
  case 0x277:
    data_x00514 = ByteCodeReader::Uint16x8_1Int1_Large(reader);
    DumpUint16x8_1Int1<Js::OpLayoutT_Uint16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00514,pFStack_20,reader);
    break;
  case 0x278:
    data_x00517 = ByteCodeReader::Uint16x8_2Int2_Large(reader);
    DumpUint16x8_2Int2<Js::OpLayoutT_Uint16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00517,pFStack_20,reader);
    break;
  case 0x279:
    data_x00520 = ByteCodeReader::Uint16x8_3_Large(reader);
    DumpUint16x8_3<Js::OpLayoutT_Uint16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00520,pFStack_20,reader);
    break;
  case 0x27a:
    data_x00523 = ByteCodeReader::Bool16x8_1Uint16x8_2_Large(reader);
    DumpBool16x8_1Uint16x8_2<Js::OpLayoutT_Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00523,pFStack_20,reader);
    break;
  case 0x27b:
    data_x00526 = ByteCodeReader::Uint16x8_1Bool16x8_1Uint16x8_2_Large(reader);
    DumpUint16x8_1Bool16x8_1Uint16x8_2<Js::OpLayoutT_Uint16x8_1Bool16x8_1Uint16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00526,pFStack_20,reader);
    break;
  case 0x27c:
    data_x00529 = ByteCodeReader::Uint16x8_2Int1_Large(reader);
    DumpUint16x8_2Int1<Js::OpLayoutT_Uint16x8_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00529,pFStack_20,reader);
    break;
  case 0x27d:
    data_x00532 = ByteCodeReader::Uint16x8_1Float32x4_1_Large(reader);
    DumpUint16x8_1Float32x4_1<Js::OpLayoutT_Uint16x8_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00532,pFStack_20,reader);
    break;
  case 0x27e:
    data_x00535 = ByteCodeReader::Uint16x8_1Int32x4_1_Large(reader);
    DumpUint16x8_1Int32x4_1<Js::OpLayoutT_Uint16x8_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00535,pFStack_20,reader);
    break;
  case 0x27f:
    data_x00538 = ByteCodeReader::Uint16x8_1Int16x8_1_Large(reader);
    DumpUint16x8_1Int16x8_1<Js::OpLayoutT_Uint16x8_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00538,pFStack_20,reader);
    break;
  case 0x280:
    data_x00541 = ByteCodeReader::Uint16x8_1Int8x16_1_Large(reader);
    DumpUint16x8_1Int8x16_1<Js::OpLayoutT_Uint16x8_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00541,pFStack_20,reader);
    break;
  case 0x281:
    data_x00544 = ByteCodeReader::Uint16x8_1Uint32x4_1_Large(reader);
    DumpUint16x8_1Uint32x4_1<Js::OpLayoutT_Uint16x8_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00544,pFStack_20,reader);
    break;
  case 0x282:
    data_x00547 = ByteCodeReader::Uint16x8_1Uint8x16_1_Large(reader);
    DumpUint16x8_1Uint8x16_1<Js::OpLayoutT_Uint16x8_1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00547,pFStack_20,reader);
    break;
  case 0x283:
    data_x00550 = ByteCodeReader::Uint8x16_1Int16_Large(reader);
    DumpUint8x16_1Int16<Js::OpLayoutT_Uint8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00550,pFStack_20,reader);
    break;
  case 0x284:
    data_x00553 = ByteCodeReader::Reg1Uint8x16_1_Large(reader);
    DumpReg1Uint8x16_1<Js::OpLayoutT_Reg1Uint8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00553,pFStack_20,reader);
    break;
  case 0x285:
    data_x00556 = ByteCodeReader::Uint8x16_2_Large(reader);
    DumpUint8x16_2<Js::OpLayoutT_Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00556,pFStack_20,reader);
    break;
  case 0x286:
    data_x00559 = ByteCodeReader::Int1Uint8x16_1Int1_Large(reader);
    DumpInt1Uint8x16_1Int1<Js::OpLayoutT_Int1Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00559,pFStack_20,reader);
    break;
  case 0x287:
    data_x00562 = ByteCodeReader::Uint8x16_2Int16_Large(reader);
    DumpUint8x16_2Int16<Js::OpLayoutT_Uint8x16_2Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00562,pFStack_20,reader);
    break;
  case 0x288:
    data_x00565 = ByteCodeReader::Uint8x16_3Int16_Large(reader);
    DumpUint8x16_3Int16<Js::OpLayoutT_Uint8x16_3Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00565,pFStack_20,reader);
    break;
  case 0x289:
    data_x00568 = ByteCodeReader::Uint8x16_1Int1_Large(reader);
    DumpUint8x16_1Int1<Js::OpLayoutT_Uint8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00568,pFStack_20,reader);
    break;
  case 0x28a:
    data_x00571 = ByteCodeReader::Uint8x16_2Int2_Large(reader);
    DumpUint8x16_2Int2<Js::OpLayoutT_Uint8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00571,pFStack_20,reader);
    break;
  case 0x28b:
    data_x00574 = ByteCodeReader::Uint8x16_3_Large(reader);
    DumpUint8x16_3<Js::OpLayoutT_Uint8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00574,pFStack_20,reader);
    break;
  case 0x28c:
    data_x00577 = ByteCodeReader::Bool8x16_1Uint8x16_2_Large(reader);
    DumpBool8x16_1Uint8x16_2<Js::OpLayoutT_Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00577,pFStack_20,reader);
    break;
  case 0x28d:
    data_x00580 = ByteCodeReader::Uint8x16_1Bool8x16_1Uint8x16_2_Large(reader);
    DumpUint8x16_1Bool8x16_1Uint8x16_2<Js::OpLayoutT_Uint8x16_1Bool8x16_1Uint8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00580,pFStack_20,reader);
    break;
  case 0x28e:
    data_x00583 = ByteCodeReader::Uint8x16_2Int1_Large(reader);
    DumpUint8x16_2Int1<Js::OpLayoutT_Uint8x16_2Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00583,pFStack_20,reader);
    break;
  case 0x28f:
    data_x00586 = ByteCodeReader::Uint8x16_1Float32x4_1_Large(reader);
    DumpUint8x16_1Float32x4_1<Js::OpLayoutT_Uint8x16_1Float32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00586,pFStack_20,reader);
    break;
  case 0x290:
    data_x00589 = ByteCodeReader::Uint8x16_1Int32x4_1_Large(reader);
    DumpUint8x16_1Int32x4_1<Js::OpLayoutT_Uint8x16_1Int32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00589,pFStack_20,reader);
    break;
  case 0x291:
    data_x00592 = ByteCodeReader::Uint8x16_1Int16x8_1_Large(reader);
    DumpUint8x16_1Int16x8_1<Js::OpLayoutT_Uint8x16_1Int16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00592,pFStack_20,reader);
    break;
  case 0x292:
    data_x00595 = ByteCodeReader::Uint8x16_1Int8x16_1_Large(reader);
    DumpUint8x16_1Int8x16_1<Js::OpLayoutT_Uint8x16_1Int8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00595,pFStack_20,reader);
    break;
  case 0x293:
    data_x00598 = ByteCodeReader::Uint8x16_1Uint32x4_1_Large(reader);
    DumpUint8x16_1Uint32x4_1<Js::OpLayoutT_Uint8x16_1Uint32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00598,pFStack_20,reader);
    break;
  case 0x294:
    data_x00601 = ByteCodeReader::Uint8x16_1Uint16x8_1_Large(reader);
    DumpUint8x16_1Uint16x8_1<Js::OpLayoutT_Uint8x16_1Uint16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00601,pFStack_20,reader);
    break;
  case 0x295:
    data_x00604 = ByteCodeReader::Bool32x4_1Int1_Large(reader);
    DumpBool32x4_1Int1<Js::OpLayoutT_Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00604,pFStack_20,reader);
    break;
  case 0x296:
    data_x00607 = ByteCodeReader::Bool32x4_1Int4_Large(reader);
    DumpBool32x4_1Int4<Js::OpLayoutT_Bool32x4_1Int4<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00607,pFStack_20,reader);
    break;
  case 0x297:
    data_x00610 = ByteCodeReader::Int1Bool32x4_1Int1_Large(reader);
    DumpInt1Bool32x4_1Int1<Js::OpLayoutT_Int1Bool32x4_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00610,pFStack_20,reader);
    break;
  case 0x298:
    data_x00613 = ByteCodeReader::Bool32x4_2Int2_Large(reader);
    DumpBool32x4_2Int2<Js::OpLayoutT_Bool32x4_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00613,pFStack_20,reader);
    break;
  case 0x299:
    data_x00616 = ByteCodeReader::Int1Bool32x4_1_Large(reader);
    DumpInt1Bool32x4_1<Js::OpLayoutT_Int1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00616,pFStack_20,reader);
    break;
  case 0x29a:
    data_x00619 = ByteCodeReader::Bool32x4_2_Large(reader);
    DumpBool32x4_2<Js::OpLayoutT_Bool32x4_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00619,pFStack_20,reader);
    break;
  case 0x29b:
    data_x00622 = ByteCodeReader::Bool32x4_3_Large(reader);
    DumpBool32x4_3<Js::OpLayoutT_Bool32x4_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00622,pFStack_20,reader);
    break;
  case 0x29c:
    data_x00625 = ByteCodeReader::Reg1Bool32x4_1_Large(reader);
    DumpReg1Bool32x4_1<Js::OpLayoutT_Reg1Bool32x4_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00625,pFStack_20,reader);
    break;
  case 0x29d:
    data_x00628 = ByteCodeReader::Bool16x8_1Int1_Large(reader);
    DumpBool16x8_1Int1<Js::OpLayoutT_Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00628,pFStack_20,reader);
    break;
  case 0x29e:
    data_x00631 = ByteCodeReader::Bool16x8_1Int8_Large(reader);
    DumpBool16x8_1Int8<Js::OpLayoutT_Bool16x8_1Int8<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00631,pFStack_20,reader);
    break;
  case 0x29f:
    data_x00634 = ByteCodeReader::Int1Bool16x8_1Int1_Large(reader);
    DumpInt1Bool16x8_1Int1<Js::OpLayoutT_Int1Bool16x8_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00634,pFStack_20,reader);
    break;
  case 0x2a0:
    data_x00637 = ByteCodeReader::Bool16x8_2Int2_Large(reader);
    DumpBool16x8_2Int2<Js::OpLayoutT_Bool16x8_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00637,pFStack_20,reader);
    break;
  case 0x2a1:
    data_x00640 = ByteCodeReader::Int1Bool16x8_1_Large(reader);
    DumpInt1Bool16x8_1<Js::OpLayoutT_Int1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00640,pFStack_20,reader);
    break;
  case 0x2a2:
    data_x00643 = ByteCodeReader::Bool16x8_2_Large(reader);
    DumpBool16x8_2<Js::OpLayoutT_Bool16x8_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00643,pFStack_20,reader);
    break;
  case 0x2a3:
    data_x00646 = ByteCodeReader::Bool16x8_3_Large(reader);
    DumpBool16x8_3<Js::OpLayoutT_Bool16x8_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00646,pFStack_20,reader);
    break;
  case 0x2a4:
    data_x00649 = ByteCodeReader::Reg1Bool16x8_1_Large(reader);
    DumpReg1Bool16x8_1<Js::OpLayoutT_Reg1Bool16x8_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00649,pFStack_20,reader);
    break;
  case 0x2a5:
    data_x00652 = ByteCodeReader::Bool8x16_1Int1_Large(reader);
    DumpBool8x16_1Int1<Js::OpLayoutT_Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00652,pFStack_20,reader);
    break;
  case 0x2a6:
    data_x00655 = ByteCodeReader::Bool8x16_1Int16_Large(reader);
    DumpBool8x16_1Int16<Js::OpLayoutT_Bool8x16_1Int16<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00655,pFStack_20,reader);
    break;
  case 0x2a7:
    data_x00658 = ByteCodeReader::Int1Bool8x16_1_Large(reader);
    DumpInt1Bool8x16_1<Js::OpLayoutT_Int1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00658,pFStack_20,reader);
    break;
  case 0x2a8:
    data_x00661 = ByteCodeReader::Int1Bool8x16_1Int1_Large(reader);
    DumpInt1Bool8x16_1Int1<Js::OpLayoutT_Int1Bool8x16_1Int1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00661,pFStack_20,reader);
    break;
  case 0x2a9:
    data_x00664 = ByteCodeReader::Bool8x16_2Int2_Large(reader);
    DumpBool8x16_2Int2<Js::OpLayoutT_Bool8x16_2Int2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00664,pFStack_20,reader);
    break;
  case 0x2aa:
    data_x00667 = ByteCodeReader::Bool8x16_2_Large(reader);
    DumpBool8x16_2<Js::OpLayoutT_Bool8x16_2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00667,pFStack_20,reader);
    break;
  case 0x2ab:
    data_x00670 = ByteCodeReader::Bool8x16_3_Large(reader);
    DumpBool8x16_3<Js::OpLayoutT_Bool8x16_3<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00670,pFStack_20,reader);
    break;
  case 0x2ac:
    data_x00673 = ByteCodeReader::Reg1Bool8x16_1_Large(reader);
    DumpReg1Bool8x16_1<Js::OpLayoutT_Reg1Bool8x16_1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00673,pFStack_20,reader);
    break;
  case 0x2ad:
    data_x00676 = ByteCodeReader::AsmSimdTypedArr_Large(reader);
    DumpAsmSimdTypedArr<Js::OpLayoutT_AsmSimdTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00676,pFStack_20,reader);
    break;
  case 0x2ae:
    data_x00679 = ByteCodeReader::AsmShuffle_Large(reader);
    DumpAsmShuffle<Js::OpLayoutT_AsmShuffle<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
              (op,data_x00679,pFStack_20,reader);
  }
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpOp(OpCodeAsmJs op, LayoutSize layoutSize, ByteCodeReader& reader, FunctionBody* dumpFunction)
    {
        Output::Print(_u("%-20s"), OpCodeUtilAsmJs::GetOpCodeName(op));
        OpLayoutTypeAsmJs nType = OpCodeUtilAsmJs::GetOpCodeLayout(op);
        switch (layoutSize * OpLayoutTypeAsmJs::Count + nType)
        {
#define LAYOUT_TYPE(layout) \
            case OpLayoutTypeAsmJs::layout: \
                Assert(layoutSize == SmallLayout); \
                Dump##layout(op, reader.layout(), dumpFunction, reader); \
                break;
#define LAYOUT_TYPE_WMS(layout) \
            case SmallLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Small(), dumpFunction, reader); \
                break; \
            case MediumLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Medium(), dumpFunction, reader); \
                break; \
            case LargeLayout * OpLayoutTypeAsmJs::Count + OpLayoutTypeAsmJs::layout: \
                Dump##layout(op, reader.layout##_Large(), dumpFunction, reader); \
                break;
#include "LayoutTypesAsmJs.h"

        default:
            AssertMsg(false, "Unknown OpLayout");
            break;
        }
    }